

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  byte bVar91;
  ulong uVar92;
  ulong uVar93;
  uint uVar94;
  uint uVar95;
  ulong uVar96;
  long lVar97;
  Geometry *pGVar98;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar105;
  undefined1 auVar114 [16];
  undefined8 in_R10;
  ulong uVar99;
  long lVar100;
  long lVar101;
  byte bVar102;
  ulong uVar103;
  float fVar104;
  float fVar159;
  float fVar161;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar111 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar112 [16];
  float fVar160;
  float fVar162;
  float fVar164;
  float fVar165;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar113 [16];
  float fVar163;
  float fVar166;
  float fVar167;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  float fVar168;
  undefined4 uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar183 [64];
  undefined8 uVar189;
  undefined1 auVar190 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar206;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  RTCFilterFunctionNArguments local_840;
  undefined1 local_810 [16];
  RayHitK<16> *local_7f8;
  undefined1 (*local_7f0) [32];
  long local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 uStack_768;
  undefined4 uStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar92 = (ulong)(byte)prim[1];
  fVar3 = *(float *)(prim + uVar92 * 0x19 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar27 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar192 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar193 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar92 * 0x19 + 6));
  fVar200 = fVar3 * auVar193._0_4_;
  fVar168 = fVar3 * auVar192._0_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar92 * 4 + 6);
  auVar121 = vpmovsxbd_avx2(auVar106);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar92 * 5 + 6);
  auVar119 = vpmovsxbd_avx2(auVar27);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar92 * 6 + 6);
  auVar120 = vpmovsxbd_avx2(auVar7);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar92 * 0xb + 6);
  auVar130 = vpmovsxbd_avx2(auVar114);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar92 * 0xc + 6);
  auVar123 = vpmovsxbd_avx2(auVar109);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar92 * 0xd + 6);
  auVar122 = vpmovsxbd_avx2(auVar110);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar92 * 0x12 + 6);
  auVar129 = vpmovsxbd_avx2(auVar108);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar92 * 0x13 + 6);
  auVar128 = vpmovsxbd_avx2(auVar107);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar92 * 0x14 + 6);
  auVar125 = vpmovsxbd_avx2(auVar8);
  auVar124 = vcvtdq2ps_avx(auVar125);
  auVar231._4_4_ = fVar168;
  auVar231._0_4_ = fVar168;
  auVar231._8_4_ = fVar168;
  auVar231._12_4_ = fVar168;
  auVar231._16_4_ = fVar168;
  auVar231._20_4_ = fVar168;
  auVar231._24_4_ = fVar168;
  auVar231._28_4_ = fVar168;
  auVar233._8_4_ = 1;
  auVar233._0_8_ = 0x100000001;
  auVar233._12_4_ = 1;
  auVar233._16_4_ = 1;
  auVar233._20_4_ = 1;
  auVar233._24_4_ = 1;
  auVar233._28_4_ = 1;
  auVar115 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar236 = ZEXT3264(auVar115);
  auVar118 = ZEXT1632(CONCAT412(fVar3 * auVar192._12_4_,
                                CONCAT48(fVar3 * auVar192._8_4_,
                                         CONCAT44(fVar3 * auVar192._4_4_,fVar168))));
  auVar117 = vpermps_avx2(auVar233,auVar118);
  auVar116 = vpermps_avx512vl(auVar115,auVar118);
  fVar168 = auVar116._0_4_;
  auVar183._0_4_ = fVar168 * auVar120._0_4_;
  fVar184 = auVar116._4_4_;
  auVar183._4_4_ = fVar184 * auVar120._4_4_;
  fVar185 = auVar116._8_4_;
  auVar183._8_4_ = fVar185 * auVar120._8_4_;
  fVar191 = auVar116._12_4_;
  auVar183._12_4_ = fVar191 * auVar120._12_4_;
  fVar186 = auVar116._16_4_;
  auVar183._16_4_ = fVar186 * auVar120._16_4_;
  fVar187 = auVar116._20_4_;
  auVar183._20_4_ = fVar187 * auVar120._20_4_;
  fVar188 = auVar116._24_4_;
  auVar183._28_36_ = in_ZMM4._28_36_;
  auVar183._24_4_ = fVar188 * auVar120._24_4_;
  auVar118._4_4_ = auVar122._4_4_ * fVar184;
  auVar118._0_4_ = auVar122._0_4_ * fVar168;
  auVar118._8_4_ = auVar122._8_4_ * fVar185;
  auVar118._12_4_ = auVar122._12_4_ * fVar191;
  auVar118._16_4_ = auVar122._16_4_ * fVar186;
  auVar118._20_4_ = auVar122._20_4_ * fVar187;
  auVar118._24_4_ = auVar122._24_4_ * fVar188;
  auVar118._28_4_ = auVar125._28_4_;
  auVar125._4_4_ = auVar124._4_4_ * fVar184;
  auVar125._0_4_ = auVar124._0_4_ * fVar168;
  auVar125._8_4_ = auVar124._8_4_ * fVar185;
  auVar125._12_4_ = auVar124._12_4_ * fVar191;
  auVar125._16_4_ = auVar124._16_4_ * fVar186;
  auVar125._20_4_ = auVar124._20_4_ * fVar187;
  auVar125._24_4_ = auVar124._24_4_ * fVar188;
  auVar125._28_4_ = auVar116._28_4_;
  auVar106 = vfmadd231ps_fma(auVar183._0_32_,auVar117,auVar119);
  auVar27 = vfmadd231ps_fma(auVar118,auVar117,auVar123);
  auVar7 = vfmadd231ps_fma(auVar125,auVar128,auVar117);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar231,auVar121);
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar231,auVar130);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar129,auVar231);
  auVar232._4_4_ = fVar200;
  auVar232._0_4_ = fVar200;
  auVar232._8_4_ = fVar200;
  auVar232._12_4_ = fVar200;
  auVar232._16_4_ = fVar200;
  auVar232._20_4_ = fVar200;
  auVar232._24_4_ = fVar200;
  auVar232._28_4_ = fVar200;
  auVar117 = ZEXT1632(CONCAT412(fVar3 * auVar193._12_4_,
                                CONCAT48(fVar3 * auVar193._8_4_,
                                         CONCAT44(fVar3 * auVar193._4_4_,fVar200))));
  auVar125 = vpermps_avx2(auVar233,auVar117);
  auVar117 = vpermps_avx512vl(auVar115,auVar117);
  auVar118 = vmulps_avx512vl(auVar117,auVar120);
  auVar127._0_4_ = auVar117._0_4_ * auVar122._0_4_;
  auVar127._4_4_ = auVar117._4_4_ * auVar122._4_4_;
  auVar127._8_4_ = auVar117._8_4_ * auVar122._8_4_;
  auVar127._12_4_ = auVar117._12_4_ * auVar122._12_4_;
  auVar127._16_4_ = auVar117._16_4_ * auVar122._16_4_;
  auVar127._20_4_ = auVar117._20_4_ * auVar122._20_4_;
  auVar127._24_4_ = auVar117._24_4_ * auVar122._24_4_;
  auVar127._28_4_ = 0;
  auVar122._4_4_ = auVar117._4_4_ * auVar124._4_4_;
  auVar122._0_4_ = auVar117._0_4_ * auVar124._0_4_;
  auVar122._8_4_ = auVar117._8_4_ * auVar124._8_4_;
  auVar122._12_4_ = auVar117._12_4_ * auVar124._12_4_;
  auVar122._16_4_ = auVar117._16_4_ * auVar124._16_4_;
  auVar122._20_4_ = auVar117._20_4_ * auVar124._20_4_;
  auVar122._24_4_ = auVar117._24_4_ * auVar124._24_4_;
  auVar122._28_4_ = auVar120._28_4_;
  auVar119 = vfmadd231ps_avx512vl(auVar118,auVar125,auVar119);
  auVar114 = vfmadd231ps_fma(auVar127,auVar125,auVar123);
  auVar109 = vfmadd231ps_fma(auVar122,auVar125,auVar128);
  auVar119 = vfmadd231ps_avx512vl(auVar119,auVar232,auVar121);
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar232,auVar130);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar223._16_4_ = 0x7fffffff;
  auVar223._20_4_ = 0x7fffffff;
  auVar223._24_4_ = 0x7fffffff;
  auVar223._28_4_ = 0x7fffffff;
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar232,auVar129);
  auVar121 = vandps_avx(ZEXT1632(auVar106),auVar223);
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar221._16_4_ = 0x219392ef;
  auVar221._20_4_ = 0x219392ef;
  auVar221._24_4_ = 0x219392ef;
  auVar221._28_4_ = 0x219392ef;
  uVar99 = vcmpps_avx512vl(auVar121,auVar221,1);
  bVar13 = (bool)((byte)uVar99 & 1);
  auVar117._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._0_4_;
  bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._4_4_;
  bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._8_4_;
  bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar106._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar121 = vandps_avx(ZEXT1632(auVar27),auVar223);
  uVar99 = vcmpps_avx512vl(auVar121,auVar221,1);
  bVar13 = (bool)((byte)uVar99 & 1);
  auVar115._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._0_4_;
  bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._4_4_;
  bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._8_4_;
  bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar121 = vandps_avx(ZEXT1632(auVar7),auVar223);
  uVar99 = vcmpps_avx512vl(auVar121,auVar221,1);
  bVar13 = (bool)((byte)uVar99 & 1);
  auVar121._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar7._0_4_;
  bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar121._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar7._4_4_;
  bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar121._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar7._8_4_;
  bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar121._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar7._12_4_;
  auVar121._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar121._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar121._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar121._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar120 = vrcp14ps_avx512vl(auVar117);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar222._16_4_ = 0x3f800000;
  auVar222._20_4_ = 0x3f800000;
  auVar222._24_4_ = 0x3f800000;
  auVar222._28_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar117,auVar120,auVar222);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar120,auVar120);
  auVar120 = vrcp14ps_avx512vl(auVar115);
  auVar27 = vfnmadd213ps_fma(auVar115,auVar120,auVar222);
  auVar27 = vfmadd132ps_fma(ZEXT1632(auVar27),auVar120,auVar120);
  auVar120 = vrcp14ps_avx512vl(auVar121);
  auVar7 = vfnmadd213ps_fma(auVar121,auVar120,auVar222);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar120,auVar120);
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 7 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx512vl(auVar121,auVar119);
  auVar129._4_4_ = auVar106._4_4_ * auVar121._4_4_;
  auVar129._0_4_ = auVar106._0_4_ * auVar121._0_4_;
  auVar129._8_4_ = auVar106._8_4_ * auVar121._8_4_;
  auVar129._12_4_ = auVar106._12_4_ * auVar121._12_4_;
  auVar129._16_4_ = auVar121._16_4_ * 0.0;
  auVar129._20_4_ = auVar121._20_4_ * 0.0;
  auVar129._24_4_ = auVar121._24_4_ * 0.0;
  auVar129._28_4_ = auVar121._28_4_;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 9 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx512vl(auVar121,auVar119);
  auVar131._0_4_ = auVar106._0_4_ * auVar121._0_4_;
  auVar131._4_4_ = auVar106._4_4_ * auVar121._4_4_;
  auVar131._8_4_ = auVar106._8_4_ * auVar121._8_4_;
  auVar131._12_4_ = auVar106._12_4_ * auVar121._12_4_;
  auVar131._16_4_ = auVar121._16_4_ * 0.0;
  auVar131._20_4_ = auVar121._20_4_ * 0.0;
  auVar131._24_4_ = auVar121._24_4_ * 0.0;
  auVar131._28_4_ = 0;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0xe + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar114));
  auVar128._4_4_ = auVar27._4_4_ * auVar121._4_4_;
  auVar128._0_4_ = auVar27._0_4_ * auVar121._0_4_;
  auVar128._8_4_ = auVar27._8_4_ * auVar121._8_4_;
  auVar128._12_4_ = auVar27._12_4_ * auVar121._12_4_;
  auVar128._16_4_ = auVar121._16_4_ * 0.0;
  auVar128._20_4_ = auVar121._20_4_ * 0.0;
  auVar128._24_4_ = auVar121._24_4_ * 0.0;
  auVar128._28_4_ = auVar121._28_4_;
  auVar122 = vpbroadcastd_avx512vl();
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar114));
  auVar126._0_4_ = auVar27._0_4_ * auVar121._0_4_;
  auVar126._4_4_ = auVar27._4_4_ * auVar121._4_4_;
  auVar126._8_4_ = auVar27._8_4_ * auVar121._8_4_;
  auVar126._12_4_ = auVar27._12_4_ * auVar121._12_4_;
  auVar126._16_4_ = auVar121._16_4_ * 0.0;
  auVar126._20_4_ = auVar121._20_4_ * 0.0;
  auVar126._24_4_ = auVar121._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x15 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar109));
  auVar124._4_4_ = auVar121._4_4_ * auVar7._4_4_;
  auVar124._0_4_ = auVar121._0_4_ * auVar7._0_4_;
  auVar124._8_4_ = auVar121._8_4_ * auVar7._8_4_;
  auVar124._12_4_ = auVar121._12_4_ * auVar7._12_4_;
  auVar124._16_4_ = auVar121._16_4_ * 0.0;
  auVar124._20_4_ = auVar121._20_4_ * 0.0;
  auVar124._24_4_ = auVar121._24_4_ * 0.0;
  auVar124._28_4_ = auVar121._28_4_;
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x17 + 6));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar121 = vsubps_avx(auVar121,ZEXT1632(auVar109));
  auVar116._0_4_ = auVar7._0_4_ * auVar121._0_4_;
  auVar116._4_4_ = auVar7._4_4_ * auVar121._4_4_;
  auVar116._8_4_ = auVar7._8_4_ * auVar121._8_4_;
  auVar116._12_4_ = auVar7._12_4_ * auVar121._12_4_;
  auVar116._16_4_ = auVar121._16_4_ * 0.0;
  auVar116._20_4_ = auVar121._20_4_ * 0.0;
  auVar116._24_4_ = auVar121._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar121 = vpminsd_avx2(auVar129,auVar131);
  auVar119 = vpminsd_avx2(auVar128,auVar126);
  auVar121 = vmaxps_avx(auVar121,auVar119);
  auVar119 = vpminsd_avx2(auVar124,auVar116);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar120._4_4_ = uVar4;
  auVar120._0_4_ = uVar4;
  auVar120._8_4_ = uVar4;
  auVar120._12_4_ = uVar4;
  auVar120._16_4_ = uVar4;
  auVar120._20_4_ = uVar4;
  auVar120._24_4_ = uVar4;
  auVar120._28_4_ = uVar4;
  auVar119 = vmaxps_avx512vl(auVar119,auVar120);
  auVar121 = vmaxps_avx(auVar121,auVar119);
  auVar119._8_4_ = 0x3f7ffffa;
  auVar119._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar119._12_4_ = 0x3f7ffffa;
  auVar119._16_4_ = 0x3f7ffffa;
  auVar119._20_4_ = 0x3f7ffffa;
  auVar119._24_4_ = 0x3f7ffffa;
  auVar119._28_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar121,auVar119);
  auVar121 = vpmaxsd_avx2(auVar129,auVar131);
  auVar119 = vpmaxsd_avx2(auVar128,auVar126);
  auVar121 = vminps_avx(auVar121,auVar119);
  auVar119 = vpmaxsd_avx2(auVar124,auVar116);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar130._4_4_ = uVar4;
  auVar130._0_4_ = uVar4;
  auVar130._8_4_ = uVar4;
  auVar130._12_4_ = uVar4;
  auVar130._16_4_ = uVar4;
  auVar130._20_4_ = uVar4;
  auVar130._24_4_ = uVar4;
  auVar130._28_4_ = uVar4;
  auVar119 = vminps_avx512vl(auVar119,auVar130);
  auVar121 = vminps_avx(auVar121,auVar119);
  auVar123._8_4_ = 0x3f800003;
  auVar123._0_8_ = 0x3f8000033f800003;
  auVar123._12_4_ = 0x3f800003;
  auVar123._16_4_ = 0x3f800003;
  auVar123._20_4_ = 0x3f800003;
  auVar123._24_4_ = 0x3f800003;
  auVar123._28_4_ = 0x3f800003;
  auVar121 = vmulps_avx512vl(auVar121,auVar123);
  uVar189 = vcmpps_avx512vl(local_3a0,auVar121,2);
  uVar28 = vpcmpgtd_avx512vl(auVar122,_DAT_01fb4ba0);
  uVar99 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar189 & (byte)uVar28));
  local_7f0 = (undefined1 (*) [32])local_100;
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar106);
  auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar183);
  auVar183 = ZEXT464(0x35000000);
  local_7f8 = ray;
  do {
    if (uVar99 == 0) {
      return;
    }
    lVar97 = 0;
    for (uVar93 = uVar99; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      lVar97 = lVar97 + 1;
    }
    uVar99 = uVar99 - 1 & uVar99;
    uVar4 = *(undefined4 *)(prim + lVar97 * 4 + 6);
    uVar93 = (ulong)(uint)((int)lVar97 << 6);
    uVar9 = *(uint *)(prim + 2);
    pGVar98 = (context->scene->geometries).items[uVar9].ptr;
    auVar106 = *(undefined1 (*) [16])(prim + uVar93 + uVar92 * 0x19 + 0x16);
    if (uVar99 != 0) {
      uVar96 = uVar99 - 1 & uVar99;
      for (uVar103 = uVar99; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      }
      if (uVar96 != 0) {
        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar27 = *(undefined1 (*) [16])(prim + uVar93 + uVar92 * 0x19 + 0x26);
    auVar7 = *(undefined1 (*) [16])(prim + uVar93 + uVar92 * 0x19 + 0x36);
    auVar114 = *(undefined1 (*) [16])(prim + uVar93 + uVar92 * 0x19 + 0x46);
    iVar10 = (int)pGVar98[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    auVar109 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar108 = vsubps_avx(auVar106,auVar109);
    uVar169 = auVar108._0_4_;
    auVar192._4_4_ = uVar169;
    auVar192._0_4_ = uVar169;
    auVar192._8_4_ = uVar169;
    auVar192._12_4_ = uVar169;
    auVar110 = vshufps_avx(auVar108,auVar108,0x55);
    aVar5 = pre->ray_space[k].vx.field_0;
    aVar6 = pre->ray_space[k].vy.field_0;
    auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
    fVar3 = pre->ray_space[k].vz.field_0.m128[0];
    fVar168 = pre->ray_space[k].vz.field_0.m128[1];
    fVar184 = pre->ray_space[k].vz.field_0.m128[2];
    fVar185 = pre->ray_space[k].vz.field_0.m128[3];
    auVar111._0_4_ = fVar3 * auVar108._0_4_;
    auVar111._4_4_ = fVar168 * auVar108._4_4_;
    auVar111._8_4_ = fVar184 * auVar108._8_4_;
    auVar111._12_4_ = fVar185 * auVar108._12_4_;
    auVar110 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar6,auVar110);
    auVar8 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar192);
    auVar110 = vshufps_avx(auVar106,auVar106,0xff);
    auVar107 = vsubps_avx(auVar27,auVar109);
    uVar169 = auVar107._0_4_;
    auVar201._4_4_ = uVar169;
    auVar201._0_4_ = uVar169;
    auVar201._8_4_ = uVar169;
    auVar201._12_4_ = uVar169;
    auVar108 = vshufps_avx(auVar107,auVar107,0x55);
    auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
    auVar225._0_4_ = fVar3 * auVar107._0_4_;
    auVar225._4_4_ = fVar168 * auVar107._4_4_;
    auVar225._8_4_ = fVar184 * auVar107._8_4_;
    auVar225._12_4_ = fVar185 * auVar107._12_4_;
    auVar108 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar6,auVar108);
    auVar192 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar201);
    auVar107 = vsubps_avx512vl(auVar7,auVar109);
    uVar169 = auVar107._0_4_;
    auVar202._4_4_ = uVar169;
    auVar202._0_4_ = uVar169;
    auVar202._8_4_ = uVar169;
    auVar202._12_4_ = uVar169;
    auVar108 = vshufps_avx(auVar107,auVar107,0x55);
    auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
    auVar112._0_4_ = fVar3 * auVar107._0_4_;
    auVar112._4_4_ = fVar168 * auVar107._4_4_;
    auVar112._8_4_ = fVar184 * auVar107._8_4_;
    auVar112._12_4_ = fVar185 * auVar107._12_4_;
    auVar108 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar6,auVar108);
    auVar107 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar202);
    auVar108 = vsubps_avx512vl(auVar114,auVar109);
    uVar169 = auVar108._0_4_;
    auVar193._4_4_ = uVar169;
    auVar193._0_4_ = uVar169;
    auVar193._8_4_ = uVar169;
    auVar193._12_4_ = uVar169;
    auVar109 = vshufps_avx(auVar108,auVar108,0x55);
    auVar108 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar113._0_4_ = fVar3 * auVar108._0_4_;
    auVar113._4_4_ = fVar168 * auVar108._4_4_;
    auVar113._8_4_ = fVar184 * auVar108._8_4_;
    auVar113._12_4_ = fVar185 * auVar108._12_4_;
    auVar109 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar6,auVar109);
    auVar108 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar5,auVar193);
    lVar97 = (long)iVar10;
    lVar101 = lVar97 * 0x44;
    auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar101);
    uVar169 = auVar8._0_4_;
    local_600._4_4_ = uVar169;
    local_600._0_4_ = uVar169;
    local_600._8_4_ = uVar169;
    local_600._12_4_ = uVar169;
    local_600._16_4_ = uVar169;
    local_600._20_4_ = uVar169;
    local_600._24_4_ = uVar169;
    local_600._28_4_ = uVar169;
    auVar174._8_4_ = 1;
    auVar174._0_8_ = 0x100000001;
    auVar174._12_4_ = 1;
    auVar174._16_4_ = 1;
    auVar174._20_4_ = 1;
    auVar174._24_4_ = 1;
    auVar174._28_4_ = 1;
    local_620 = vpermps_avx2(auVar174,ZEXT1632(auVar8));
    auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0x484);
    local_640 = vbroadcastss_avx512vl(auVar192);
    local_660 = vpermps_avx512vl(auVar174,ZEXT1632(auVar192));
    auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0x908);
    local_680 = vbroadcastss_avx512vl(auVar107);
    local_6a0 = vpermps_avx512vl(auVar174,ZEXT1632(auVar107));
    auVar130 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0xd8c);
    fVar191 = auVar108._0_4_;
    local_6c0._4_4_ = fVar191;
    local_6c0._0_4_ = fVar191;
    fStack_6b8 = fVar191;
    fStack_6b4 = fVar191;
    fStack_6b0 = fVar191;
    fStack_6ac = fVar191;
    fStack_6a8 = fVar191;
    register0x0000139c = fVar191;
    _local_6e0 = vpermps_avx512vl(auVar174,ZEXT1632(auVar108));
    auVar123 = vmulps_avx512vl(_local_6c0,auVar130);
    auVar122 = vmulps_avx512vl(_local_6e0,auVar130);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,local_680);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,local_6a0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,local_640);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,local_660);
    auVar124 = vfmadd231ps_avx512vl(auVar123,auVar121,local_600);
    auVar220 = ZEXT3264(auVar124);
    auVar125 = vfmadd231ps_avx512vl(auVar122,auVar121,local_620);
    auVar217 = ZEXT3264(auVar125);
    auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar101);
    auVar122 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0x484);
    auVar129 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0x908);
    auVar128 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0xd8c);
    auVar117 = vmulps_avx512vl(_local_6c0,auVar128);
    auVar118 = vmulps_avx512vl(_local_6e0,auVar128);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar129,local_680);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar129,local_6a0);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar122,local_640);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar122,local_660);
    auVar193 = vfmadd231ps_fma(auVar117,auVar123,local_600);
    auVar224 = ZEXT1664(auVar193);
    auVar201 = vfmadd231ps_fma(auVar118,auVar123,local_620);
    auVar117 = vsubps_avx512vl(ZEXT1632(auVar193),auVar124);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar201),auVar125);
    auVar115 = vmulps_avx512vl(auVar125,auVar117);
    auVar116 = vmulps_avx512vl(auVar124,auVar118);
    auVar115 = vsubps_avx512vl(auVar115,auVar116);
    auVar109 = vshufps_avx(auVar27,auVar27,0xff);
    uVar189 = auVar110._0_8_;
    local_3c0._8_8_ = uVar189;
    local_3c0._0_8_ = uVar189;
    local_3c0._16_8_ = uVar189;
    local_3c0._24_8_ = uVar189;
    local_3e0 = vbroadcastsd_avx512vl(auVar109);
    auVar109 = vshufps_avx512vl(auVar7,auVar7,0xff);
    local_400 = vbroadcastsd_avx512vl(auVar109);
    auVar109 = vshufps_avx512vl(auVar114,auVar114,0xff);
    uVar189 = auVar109._0_8_;
    local_420._8_8_ = uVar189;
    local_420._0_8_ = uVar189;
    local_420._16_8_ = uVar189;
    local_420._24_8_ = uVar189;
    auVar116 = vmulps_avx512vl(local_420,auVar130);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,local_400);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar119,local_3e0);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_3c0);
    auVar126 = vmulps_avx512vl(local_420,auVar128);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar129,local_400);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar122,local_3e0);
    auVar202 = vfmadd231ps_fma(auVar126,auVar123,local_3c0);
    auVar126 = vmulps_avx512vl(auVar118,auVar118);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar117,auVar117);
    auVar127 = vmaxps_avx512vl(auVar116,ZEXT1632(auVar202));
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vmulps_avx512vl(auVar127,auVar126);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    uVar189 = vcmpps_avx512vl(auVar115,auVar126,2);
    auVar109 = vblendps_avx(auVar8,auVar106,8);
    auVar225 = auVar237._0_16_;
    auVar110 = vandps_avx512vl(auVar109,auVar225);
    auVar109 = vblendps_avx(auVar192,auVar27,8);
    auVar109 = vandps_avx512vl(auVar109,auVar225);
    auVar110 = vmaxps_avx(auVar110,auVar109);
    auVar109 = vblendps_avx(auVar107,auVar7,8);
    auVar111 = vandps_avx512vl(auVar109,auVar225);
    auVar109 = vblendps_avx(auVar108,auVar114,8);
    auVar109 = vandps_avx512vl(auVar109,auVar225);
    auVar109 = vmaxps_avx(auVar111,auVar109);
    auVar109 = vmaxps_avx(auVar110,auVar109);
    auVar110 = vmovshdup_avx(auVar109);
    auVar110 = vmaxss_avx(auVar110,auVar109);
    auVar109 = vshufpd_avx(auVar109,auVar109,1);
    auVar109 = vmaxss_avx(auVar109,auVar110);
    auVar110 = vcvtsi2ss_avx512f(auVar114,iVar10);
    local_7a0._0_16_ = auVar110;
    auVar229._0_4_ = auVar110._0_4_;
    auVar229._4_4_ = auVar229._0_4_;
    auVar229._8_4_ = auVar229._0_4_;
    auVar229._12_4_ = auVar229._0_4_;
    auVar229._16_4_ = auVar229._0_4_;
    auVar229._20_4_ = auVar229._0_4_;
    auVar229._24_4_ = auVar229._0_4_;
    auVar229._28_4_ = auVar229._0_4_;
    uVar28 = vcmpps_avx512vl(auVar229,_DAT_01f7b060,0xe);
    bVar102 = (byte)uVar189 & (byte)uVar28;
    local_810 = vmulss_avx512f(auVar109,auVar183._0_16_);
    auVar126 = auVar236._0_32_;
    auVar115 = vpermps_avx512vl(auVar126,ZEXT1632(auVar8));
    local_480 = vpermps_avx512vl(auVar126,ZEXT1632(auVar192));
    local_4a0 = vpermps_avx512vl(auVar126,ZEXT1632(auVar107));
    local_4c0 = vpermps_avx512vl(auVar126,ZEXT1632(auVar108));
    local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar157 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar157);
    auVar157 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar157);
    local_850 = auVar27._0_8_;
    uStack_848 = auVar27._8_8_;
    local_860 = auVar7._0_8_;
    uStack_858 = auVar7._8_8_;
    local_870._0_4_ = auVar114._0_4_;
    fVar3 = (float)local_870;
    local_870._4_4_ = auVar114._4_4_;
    fVar168 = local_870._4_4_;
    uStack_868._0_4_ = auVar114._8_4_;
    fVar184 = (float)uStack_868;
    uStack_868._4_4_ = auVar114._12_4_;
    fVar185 = uStack_868._4_4_;
    local_870 = auVar114._0_8_;
    uStack_868 = auVar114._8_8_;
    if (bVar102 != 0) {
      auVar128 = vmulps_avx512vl(local_4c0,auVar128);
      auVar129 = vfmadd213ps_avx512vl(auVar129,local_4a0,auVar128);
      auVar122 = vfmadd213ps_avx512vl(auVar122,local_480,auVar129);
      auVar122 = vfmadd213ps_avx512vl(auVar123,auVar115,auVar122);
      auVar130 = vmulps_avx512vl(local_4c0,auVar130);
      auVar120 = vfmadd213ps_avx512vl(auVar120,local_4a0,auVar130);
      auVar129 = vfmadd213ps_avx512vl(auVar119,local_480,auVar120);
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0x1210);
      auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0x1694);
      auVar130 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0x1b18);
      auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 + 0x1f9c);
      auVar129 = vfmadd213ps_avx512vl(auVar121,auVar115,auVar129);
      auVar226._0_4_ = fVar191 * auVar123._0_4_;
      auVar226._4_4_ = fVar191 * auVar123._4_4_;
      auVar226._8_4_ = fVar191 * auVar123._8_4_;
      auVar226._12_4_ = fVar191 * auVar123._12_4_;
      auVar226._16_4_ = fVar191 * auVar123._16_4_;
      auVar226._20_4_ = fVar191 * auVar123._20_4_;
      auVar226._24_4_ = fVar191 * auVar123._24_4_;
      auVar226._28_4_ = 0;
      auVar121 = vmulps_avx512vl(_local_6e0,auVar123);
      auVar123 = vmulps_avx512vl(local_4c0,auVar123);
      auVar128 = vfmadd231ps_avx512vl(auVar226,auVar130,local_680);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar130,local_6a0);
      auVar130 = vfmadd231ps_avx512vl(auVar123,local_4a0,auVar130);
      auVar123 = vfmadd231ps_avx512vl(auVar128,auVar120,local_640);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar120,local_660);
      auVar128 = vfmadd231ps_avx512vl(auVar130,local_480,auVar120);
      auVar114 = vfmadd231ps_fma(auVar123,auVar119,local_600);
      auVar123 = vfmadd231ps_avx512vl(auVar121,auVar119,local_620);
      auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0x1210);
      auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0x1b18);
      auVar130 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0x1f9c);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar115,auVar119);
      auVar42._4_4_ = fVar191 * auVar130._4_4_;
      auVar42._0_4_ = fVar191 * auVar130._0_4_;
      auVar42._8_4_ = fVar191 * auVar130._8_4_;
      auVar42._12_4_ = fVar191 * auVar130._12_4_;
      auVar42._16_4_ = fVar191 * auVar130._16_4_;
      auVar42._20_4_ = fVar191 * auVar130._20_4_;
      auVar42._24_4_ = fVar191 * auVar130._24_4_;
      auVar42._28_4_ = auVar119._28_4_;
      auVar119 = vmulps_avx512vl(_local_6e0,auVar130);
      auVar130 = vmulps_avx512vl(local_4c0,auVar130);
      auVar127 = vfmadd231ps_avx512vl(auVar42,auVar120,local_680);
      auVar131 = vfmadd231ps_avx512vl(auVar119,auVar120,local_6a0);
      auVar157 = ZEXT3264(auVar115);
      auVar120 = vfmadd231ps_avx512vl(auVar130,local_4a0,auVar120);
      auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 + 0x1694);
      auVar130 = vfmadd231ps_avx512vl(auVar127,auVar119,local_640);
      auVar127 = vfmadd231ps_avx512vl(auVar131,auVar119,local_660);
      auVar119 = vfmadd231ps_avx512vl(auVar120,local_480,auVar119);
      auVar183 = ZEXT1664(auVar183._0_16_);
      auVar236 = ZEXT3264(auVar126);
      auVar237 = ZEXT1664(auVar225);
      auVar109 = vfmadd231ps_fma(auVar130,auVar121,local_600);
      auVar120 = vfmadd231ps_avx512vl(auVar127,auVar121,local_620);
      auVar130 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar121);
      auVar234._8_4_ = 0x7fffffff;
      auVar234._0_8_ = 0x7fffffff7fffffff;
      auVar234._12_4_ = 0x7fffffff;
      auVar234._16_4_ = 0x7fffffff;
      auVar234._20_4_ = 0x7fffffff;
      auVar234._24_4_ = 0x7fffffff;
      auVar234._28_4_ = 0x7fffffff;
      auVar121 = vandps_avx(ZEXT1632(auVar114),auVar234);
      auVar119 = vandps_avx(auVar123,auVar234);
      auVar119 = vmaxps_avx(auVar121,auVar119);
      auVar121 = vandps_avx(auVar128,auVar234);
      auVar121 = vmaxps_avx(auVar119,auVar121);
      auVar230._4_4_ = local_810._0_4_;
      auVar230._0_4_ = local_810._0_4_;
      auVar230._8_4_ = local_810._0_4_;
      auVar230._12_4_ = local_810._0_4_;
      auVar230._16_4_ = local_810._0_4_;
      auVar230._20_4_ = local_810._0_4_;
      auVar230._24_4_ = local_810._0_4_;
      auVar230._28_4_ = local_810._0_4_;
      uVar93 = vcmpps_avx512vl(auVar121,auVar230,1);
      bVar13 = (bool)((byte)uVar93 & 1);
      auVar132._0_4_ = (float)((uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar114._0_4_);
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar132._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar114._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar132._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar114._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar132._12_4_ = (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar114._12_4_);
      fVar187 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_);
      auVar132._16_4_ = fVar187;
      fVar186 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_);
      auVar132._20_4_ = fVar186;
      fVar191 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_);
      auVar132._24_4_ = fVar191;
      uVar94 = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
      auVar132._28_4_ = uVar94;
      bVar13 = (bool)((byte)uVar93 & 1);
      auVar133._0_4_ = (float)((uint)bVar13 * auVar118._0_4_ | (uint)!bVar13 * auVar123._0_4_);
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar133._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar123._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar133._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar123._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar133._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar123._12_4_);
      bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
      auVar133._16_4_ = (float)((uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * auVar123._16_4_);
      bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
      auVar133._20_4_ = (float)((uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * auVar123._20_4_);
      bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
      auVar133._24_4_ = (float)((uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * auVar123._24_4_);
      bVar13 = SUB81(uVar93 >> 7,0);
      auVar133._28_4_ = (uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * auVar123._28_4_;
      auVar121 = vandps_avx(auVar234,ZEXT1632(auVar109));
      auVar119 = vandps_avx(auVar120,auVar234);
      auVar119 = vmaxps_avx(auVar121,auVar119);
      auVar121 = vandps_avx(auVar130,auVar234);
      auVar121 = vmaxps_avx(auVar119,auVar121);
      uVar93 = vcmpps_avx512vl(auVar121,auVar230,1);
      bVar13 = (bool)((byte)uVar93 & 1);
      auVar134._0_4_ = (float)((uint)bVar13 * auVar117._0_4_ | (uint)!bVar13 * auVar109._0_4_);
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar134._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar109._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar134._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar109._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar134._12_4_ = (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar109._12_4_);
      fVar206 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_);
      auVar134._16_4_ = fVar206;
      fVar200 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_);
      auVar134._20_4_ = fVar200;
      fVar188 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_);
      auVar134._24_4_ = fVar188;
      auVar134._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
      bVar13 = (bool)((byte)uVar93 & 1);
      auVar135._0_4_ = (float)((uint)bVar13 * auVar118._0_4_ | (uint)!bVar13 * auVar120._0_4_);
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar135._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar120._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar135._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar120._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar135._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar120._12_4_);
      bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
      auVar135._16_4_ = (float)((uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * auVar120._16_4_);
      bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
      auVar135._20_4_ = (float)((uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * auVar120._20_4_);
      bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
      auVar135._24_4_ = (float)((uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * auVar120._24_4_);
      bVar13 = SUB81(uVar93 >> 7,0);
      auVar135._28_4_ = (uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * auVar120._28_4_;
      auVar112 = vxorps_avx512vl(local_640._0_16_,local_640._0_16_);
      auVar121 = vfmadd213ps_avx512vl(auVar132,auVar132,ZEXT1632(auVar112));
      auVar114 = vfmadd231ps_fma(auVar121,auVar133,auVar133);
      auVar121 = vrsqrt14ps_avx512vl(ZEXT1632(auVar114));
      fVar104 = auVar121._0_4_;
      fVar105 = auVar121._4_4_;
      fVar159 = auVar121._8_4_;
      fVar160 = auVar121._12_4_;
      fVar161 = auVar121._16_4_;
      fVar162 = auVar121._20_4_;
      fVar164 = auVar121._24_4_;
      auVar43._4_4_ = fVar105 * fVar105 * fVar105 * auVar114._4_4_ * -0.5;
      auVar43._0_4_ = fVar104 * fVar104 * fVar104 * auVar114._0_4_ * -0.5;
      auVar43._8_4_ = fVar159 * fVar159 * fVar159 * auVar114._8_4_ * -0.5;
      auVar43._12_4_ = fVar160 * fVar160 * fVar160 * auVar114._12_4_ * -0.5;
      auVar43._16_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar43._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar43._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar43._28_4_ = 0;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar120 = vfmadd231ps_avx512vl(auVar43,auVar119,auVar121);
      auVar44._4_4_ = auVar133._4_4_ * auVar120._4_4_;
      auVar44._0_4_ = auVar133._0_4_ * auVar120._0_4_;
      auVar44._8_4_ = auVar133._8_4_ * auVar120._8_4_;
      auVar44._12_4_ = auVar133._12_4_ * auVar120._12_4_;
      auVar44._16_4_ = auVar133._16_4_ * auVar120._16_4_;
      auVar44._20_4_ = auVar133._20_4_ * auVar120._20_4_;
      auVar44._24_4_ = auVar133._24_4_ * auVar120._24_4_;
      auVar44._28_4_ = auVar121._28_4_;
      auVar45._4_4_ = auVar120._4_4_ * -auVar132._4_4_;
      auVar45._0_4_ = auVar120._0_4_ * -auVar132._0_4_;
      auVar45._8_4_ = auVar120._8_4_ * -auVar132._8_4_;
      auVar45._12_4_ = auVar120._12_4_ * -auVar132._12_4_;
      auVar45._16_4_ = auVar120._16_4_ * -fVar187;
      auVar45._20_4_ = auVar120._20_4_ * -fVar186;
      auVar45._24_4_ = auVar120._24_4_ * -fVar191;
      auVar45._28_4_ = uVar94 ^ 0x80000000;
      auVar121 = vmulps_avx512vl(auVar120,ZEXT1632(auVar112));
      auVar117 = ZEXT1632(auVar112);
      auVar130 = vfmadd213ps_avx512vl(auVar134,auVar134,auVar117);
      auVar114 = vfmadd231ps_fma(auVar130,auVar135,auVar135);
      auVar130 = vrsqrt14ps_avx512vl(ZEXT1632(auVar114));
      fVar191 = auVar130._0_4_;
      fVar186 = auVar130._4_4_;
      fVar187 = auVar130._8_4_;
      fVar104 = auVar130._12_4_;
      fVar105 = auVar130._16_4_;
      fVar159 = auVar130._20_4_;
      fVar160 = auVar130._24_4_;
      auVar46._4_4_ = fVar186 * fVar186 * fVar186 * auVar114._4_4_ * -0.5;
      auVar46._0_4_ = fVar191 * fVar191 * fVar191 * auVar114._0_4_ * -0.5;
      auVar46._8_4_ = fVar187 * fVar187 * fVar187 * auVar114._8_4_ * -0.5;
      auVar46._12_4_ = fVar104 * fVar104 * fVar104 * auVar114._12_4_ * -0.5;
      auVar46._16_4_ = fVar105 * fVar105 * fVar105 * -0.0;
      auVar46._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar46._24_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar46._28_4_ = 0;
      auVar119 = vfmadd231ps_avx512vl(auVar46,auVar119,auVar130);
      auVar47._4_4_ = auVar135._4_4_ * auVar119._4_4_;
      auVar47._0_4_ = auVar135._0_4_ * auVar119._0_4_;
      auVar47._8_4_ = auVar135._8_4_ * auVar119._8_4_;
      auVar47._12_4_ = auVar135._12_4_ * auVar119._12_4_;
      auVar47._16_4_ = auVar135._16_4_ * auVar119._16_4_;
      auVar47._20_4_ = auVar135._20_4_ * auVar119._20_4_;
      auVar47._24_4_ = auVar135._24_4_ * auVar119._24_4_;
      auVar47._28_4_ = auVar130._28_4_;
      auVar48._4_4_ = -auVar134._4_4_ * auVar119._4_4_;
      auVar48._0_4_ = -auVar134._0_4_ * auVar119._0_4_;
      auVar48._8_4_ = -auVar134._8_4_ * auVar119._8_4_;
      auVar48._12_4_ = -auVar134._12_4_ * auVar119._12_4_;
      auVar48._16_4_ = -fVar206 * auVar119._16_4_;
      auVar48._20_4_ = -fVar200 * auVar119._20_4_;
      auVar48._24_4_ = -fVar188 * auVar119._24_4_;
      auVar48._28_4_ = auVar120._28_4_;
      auVar119 = vmulps_avx512vl(auVar119,auVar117);
      auVar114 = vfmadd213ps_fma(auVar44,auVar116,auVar124);
      auVar109 = vfmadd213ps_fma(auVar45,auVar116,auVar125);
      auVar120 = vfmadd213ps_avx512vl(auVar121,auVar116,auVar129);
      auVar130 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar202),ZEXT1632(auVar193));
      auVar192 = vfnmadd213ps_fma(auVar44,auVar116,auVar124);
      auVar128 = ZEXT1632(auVar202);
      auVar110 = vfmadd213ps_fma(auVar48,auVar128,ZEXT1632(auVar201));
      auVar111 = vfnmadd213ps_fma(auVar45,auVar116,auVar125);
      auVar108 = vfmadd213ps_fma(auVar119,auVar128,auVar122);
      auVar123 = vfnmadd231ps_avx512vl(auVar129,auVar116,auVar121);
      auVar193 = vfnmadd213ps_fma(auVar47,auVar128,ZEXT1632(auVar193));
      auVar201 = vfnmadd213ps_fma(auVar48,auVar128,ZEXT1632(auVar201));
      auVar225 = vfnmadd231ps_fma(auVar122,ZEXT1632(auVar202),auVar119);
      auVar119 = vsubps_avx512vl(auVar130,ZEXT1632(auVar192));
      auVar121 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar111));
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar108),auVar123);
      auVar129 = vmulps_avx512vl(auVar121,auVar123);
      auVar107 = vfmsub231ps_fma(auVar129,ZEXT1632(auVar111),auVar122);
      auVar49._4_4_ = auVar192._4_4_ * auVar122._4_4_;
      auVar49._0_4_ = auVar192._0_4_ * auVar122._0_4_;
      auVar49._8_4_ = auVar192._8_4_ * auVar122._8_4_;
      auVar49._12_4_ = auVar192._12_4_ * auVar122._12_4_;
      auVar49._16_4_ = auVar122._16_4_ * 0.0;
      auVar49._20_4_ = auVar122._20_4_ * 0.0;
      auVar49._24_4_ = auVar122._24_4_ * 0.0;
      auVar49._28_4_ = auVar122._28_4_;
      auVar122 = vfmsub231ps_avx512vl(auVar49,auVar123,auVar119);
      auVar50._4_4_ = auVar111._4_4_ * auVar119._4_4_;
      auVar50._0_4_ = auVar111._0_4_ * auVar119._0_4_;
      auVar50._8_4_ = auVar111._8_4_ * auVar119._8_4_;
      auVar50._12_4_ = auVar111._12_4_ * auVar119._12_4_;
      auVar50._16_4_ = auVar119._16_4_ * 0.0;
      auVar50._20_4_ = auVar119._20_4_ * 0.0;
      auVar50._24_4_ = auVar119._24_4_ * 0.0;
      auVar50._28_4_ = auVar119._28_4_;
      auVar8 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar192),auVar121);
      auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar117,auVar122);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,ZEXT1632(auVar107));
      auVar118 = ZEXT1632(auVar112);
      uVar93 = vcmpps_avx512vl(auVar121,auVar118,2);
      bVar91 = (byte)uVar93;
      fVar104 = (float)((uint)(bVar91 & 1) * auVar114._0_4_ |
                       (uint)!(bool)(bVar91 & 1) * auVar193._0_4_);
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      fVar159 = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar193._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      fVar161 = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar193._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      fVar164 = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar193._12_4_);
      auVar129 = ZEXT1632(CONCAT412(fVar164,CONCAT48(fVar161,CONCAT44(fVar159,fVar104))));
      fVar105 = (float)((uint)(bVar91 & 1) * auVar109._0_4_ |
                       (uint)!(bool)(bVar91 & 1) * auVar201._0_4_);
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      fVar160 = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar201._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      fVar162 = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar201._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      fVar165 = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar201._12_4_);
      auVar128 = ZEXT1632(CONCAT412(fVar165,CONCAT48(fVar162,CONCAT44(fVar160,fVar105))));
      auVar136._0_4_ =
           (float)((uint)(bVar91 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar225._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar136._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar225._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar136._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar225._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar136._12_4_ = (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar225._12_4_);
      fVar187 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar120._16_4_);
      auVar136._16_4_ = fVar187;
      fVar191 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar120._20_4_);
      auVar136._20_4_ = fVar191;
      fVar186 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar120._24_4_);
      auVar136._24_4_ = fVar186;
      iVar1 = (uint)(byte)(uVar93 >> 7) * auVar120._28_4_;
      auVar136._28_4_ = iVar1;
      auVar119 = vblendmps_avx512vl(ZEXT1632(auVar192),auVar130);
      auVar137._0_4_ =
           (uint)(bVar91 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar109._0_4_;
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar137._4_4_ = (uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar109._4_4_;
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar137._8_4_ = (uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar109._8_4_;
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar137._12_4_ = (uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar109._12_4_;
      auVar137._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar119._16_4_;
      auVar137._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar119._20_4_;
      auVar137._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar119._24_4_;
      auVar137._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar119._28_4_;
      auVar119 = vblendmps_avx512vl(ZEXT1632(auVar111),ZEXT1632(auVar110));
      auVar138._0_4_ =
           (float)((uint)(bVar91 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar107._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar138._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar107._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar138._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar107._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar138._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar107._12_4_);
      fVar200 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar119._16_4_);
      auVar138._16_4_ = fVar200;
      fVar206 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar119._20_4_);
      auVar138._20_4_ = fVar206;
      fVar188 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar119._24_4_);
      auVar138._24_4_ = fVar188;
      auVar138._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar119._28_4_;
      auVar119 = vblendmps_avx512vl(auVar123,ZEXT1632(auVar108));
      auVar139._0_4_ =
           (float)((uint)(bVar91 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar120._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar139._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar120._4_4_);
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar139._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar120._8_4_);
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar139._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar120._12_4_);
      bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
      auVar139._16_4_ = (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar120._16_4_);
      bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
      auVar139._20_4_ = (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar120._20_4_);
      bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
      auVar139._24_4_ = (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar120._24_4_);
      bVar13 = SUB81(uVar93 >> 7,0);
      auVar139._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar120._28_4_;
      auVar140._0_4_ =
           (uint)(bVar91 & 1) * (int)auVar192._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar130._0_4_;
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar13 * (int)auVar192._4_4_ | (uint)!bVar13 * auVar130._4_4_;
      bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar13 * (int)auVar192._8_4_ | (uint)!bVar13 * auVar130._8_4_;
      bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar13 * (int)auVar192._12_4_ | (uint)!bVar13 * auVar130._12_4_;
      auVar140._16_4_ = (uint)!(bool)((byte)(uVar93 >> 4) & 1) * auVar130._16_4_;
      auVar140._20_4_ = (uint)!(bool)((byte)(uVar93 >> 5) & 1) * auVar130._20_4_;
      auVar140._24_4_ = (uint)!(bool)((byte)(uVar93 >> 6) & 1) * auVar130._24_4_;
      auVar140._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar130._28_4_;
      bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar93 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar141._0_4_ =
           (uint)(bVar91 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar108._0_4_;
      bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
      auVar141._4_4_ = (uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar108._4_4_;
      bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
      auVar141._8_4_ = (uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar108._8_4_;
      bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
      auVar141._12_4_ = (uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar108._12_4_;
      auVar141._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar123._16_4_;
      auVar141._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar123._20_4_;
      auVar141._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar123._24_4_;
      iVar2 = (uint)(byte)(uVar93 >> 7) * auVar123._28_4_;
      auVar141._28_4_ = iVar2;
      auVar124 = vsubps_avx512vl(auVar140,auVar129);
      auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar111._12_4_ |
                                               (uint)!bVar16 * auVar110._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar111._8_4_ |
                                                        (uint)!bVar15 * auVar110._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar111._4_4_
                                                                 | (uint)!bVar13 * auVar110._4_4_,
                                                                 (uint)(bVar91 & 1) *
                                                                 (int)auVar111._0_4_ |
                                                                 (uint)!(bool)(bVar91 & 1) *
                                                                 auVar110._0_4_)))),auVar128);
      auVar220 = ZEXT3264(auVar119);
      auVar120 = vsubps_avx(auVar141,auVar136);
      auVar130 = vsubps_avx(auVar129,auVar137);
      auVar224 = ZEXT3264(auVar130);
      auVar123 = vsubps_avx(auVar128,auVar138);
      auVar122 = vsubps_avx(auVar136,auVar139);
      auVar51._4_4_ = auVar120._4_4_ * fVar159;
      auVar51._0_4_ = auVar120._0_4_ * fVar104;
      auVar51._8_4_ = auVar120._8_4_ * fVar161;
      auVar51._12_4_ = auVar120._12_4_ * fVar164;
      auVar51._16_4_ = auVar120._16_4_ * 0.0;
      auVar51._20_4_ = auVar120._20_4_ * 0.0;
      auVar51._24_4_ = auVar120._24_4_ * 0.0;
      auVar51._28_4_ = iVar2;
      auVar114 = vfmsub231ps_fma(auVar51,auVar136,auVar124);
      auVar52._4_4_ = fVar160 * auVar124._4_4_;
      auVar52._0_4_ = fVar105 * auVar124._0_4_;
      auVar52._8_4_ = fVar162 * auVar124._8_4_;
      auVar52._12_4_ = fVar165 * auVar124._12_4_;
      auVar52._16_4_ = auVar124._16_4_ * 0.0;
      auVar52._20_4_ = auVar124._20_4_ * 0.0;
      auVar52._24_4_ = auVar124._24_4_ * 0.0;
      auVar52._28_4_ = auVar121._28_4_;
      auVar109 = vfmsub231ps_fma(auVar52,auVar129,auVar119);
      auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar118,ZEXT1632(auVar114));
      auVar213._0_4_ = auVar119._0_4_ * auVar136._0_4_;
      auVar213._4_4_ = auVar119._4_4_ * auVar136._4_4_;
      auVar213._8_4_ = auVar119._8_4_ * auVar136._8_4_;
      auVar213._12_4_ = auVar119._12_4_ * auVar136._12_4_;
      auVar213._16_4_ = auVar119._16_4_ * fVar187;
      auVar213._20_4_ = auVar119._20_4_ * fVar191;
      auVar213._24_4_ = auVar119._24_4_ * fVar186;
      auVar213._28_4_ = 0;
      auVar114 = vfmsub231ps_fma(auVar213,auVar128,auVar120);
      auVar125 = vfmadd231ps_avx512vl(auVar121,auVar118,ZEXT1632(auVar114));
      auVar121 = vmulps_avx512vl(auVar122,auVar137);
      auVar121 = vfmsub231ps_avx512vl(auVar121,auVar130,auVar139);
      auVar53._4_4_ = auVar123._4_4_ * auVar139._4_4_;
      auVar53._0_4_ = auVar123._0_4_ * auVar139._0_4_;
      auVar53._8_4_ = auVar123._8_4_ * auVar139._8_4_;
      auVar53._12_4_ = auVar123._12_4_ * auVar139._12_4_;
      auVar53._16_4_ = auVar123._16_4_ * auVar139._16_4_;
      auVar53._20_4_ = auVar123._20_4_ * auVar139._20_4_;
      auVar53._24_4_ = auVar123._24_4_ * auVar139._24_4_;
      auVar53._28_4_ = auVar139._28_4_;
      auVar114 = vfmsub231ps_fma(auVar53,auVar138,auVar122);
      auVar214._0_4_ = auVar138._0_4_ * auVar130._0_4_;
      auVar214._4_4_ = auVar138._4_4_ * auVar130._4_4_;
      auVar214._8_4_ = auVar138._8_4_ * auVar130._8_4_;
      auVar214._12_4_ = auVar138._12_4_ * auVar130._12_4_;
      auVar214._16_4_ = fVar200 * auVar130._16_4_;
      auVar214._20_4_ = fVar206 * auVar130._20_4_;
      auVar214._24_4_ = fVar188 * auVar130._24_4_;
      auVar214._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar214,auVar123,auVar137);
      auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar118,auVar121);
      auVar117 = vfmadd231ps_avx512vl(auVar121,auVar118,ZEXT1632(auVar114));
      auVar217 = ZEXT3264(auVar117);
      auVar121 = vmaxps_avx(auVar125,auVar117);
      uVar189 = vcmpps_avx512vl(auVar121,auVar118,2);
      bVar102 = bVar102 & (byte)uVar189;
      if (bVar102 != 0) {
        auVar54._4_4_ = auVar122._4_4_ * auVar119._4_4_;
        auVar54._0_4_ = auVar122._0_4_ * auVar119._0_4_;
        auVar54._8_4_ = auVar122._8_4_ * auVar119._8_4_;
        auVar54._12_4_ = auVar122._12_4_ * auVar119._12_4_;
        auVar54._16_4_ = auVar122._16_4_ * auVar119._16_4_;
        auVar54._20_4_ = auVar122._20_4_ * auVar119._20_4_;
        auVar54._24_4_ = auVar122._24_4_ * auVar119._24_4_;
        auVar54._28_4_ = auVar121._28_4_;
        auVar108 = vfmsub231ps_fma(auVar54,auVar123,auVar120);
        auVar55._4_4_ = auVar120._4_4_ * auVar130._4_4_;
        auVar55._0_4_ = auVar120._0_4_ * auVar130._0_4_;
        auVar55._8_4_ = auVar120._8_4_ * auVar130._8_4_;
        auVar55._12_4_ = auVar120._12_4_ * auVar130._12_4_;
        auVar55._16_4_ = auVar120._16_4_ * auVar130._16_4_;
        auVar55._20_4_ = auVar120._20_4_ * auVar130._20_4_;
        auVar55._24_4_ = auVar120._24_4_ * auVar130._24_4_;
        auVar55._28_4_ = auVar120._28_4_;
        auVar110 = vfmsub231ps_fma(auVar55,auVar124,auVar122);
        auVar56._4_4_ = auVar123._4_4_ * auVar124._4_4_;
        auVar56._0_4_ = auVar123._0_4_ * auVar124._0_4_;
        auVar56._8_4_ = auVar123._8_4_ * auVar124._8_4_;
        auVar56._12_4_ = auVar123._12_4_ * auVar124._12_4_;
        auVar56._16_4_ = auVar123._16_4_ * auVar124._16_4_;
        auVar56._20_4_ = auVar123._20_4_ * auVar124._20_4_;
        auVar56._24_4_ = auVar123._24_4_ * auVar124._24_4_;
        auVar56._28_4_ = auVar123._28_4_;
        auVar107 = vfmsub231ps_fma(auVar56,auVar130,auVar119);
        auVar114 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar110),ZEXT1632(auVar107));
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT1632(auVar108),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar121 = vrcp14ps_avx512vl(ZEXT1632(auVar109));
        auVar224 = ZEXT3264(auVar121);
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar33._16_4_ = 0x3f800000;
        auVar33._20_4_ = 0x3f800000;
        auVar33._24_4_ = 0x3f800000;
        auVar33._28_4_ = 0x3f800000;
        auVar119 = vfnmadd213ps_avx512vl(auVar121,ZEXT1632(auVar109),auVar33);
        auVar114 = vfmadd132ps_fma(auVar119,auVar121,auVar121);
        auVar220 = ZEXT1664(auVar114);
        auVar57._4_4_ = auVar107._4_4_ * auVar136._4_4_;
        auVar57._0_4_ = auVar107._0_4_ * auVar136._0_4_;
        auVar57._8_4_ = auVar107._8_4_ * auVar136._8_4_;
        auVar57._12_4_ = auVar107._12_4_ * auVar136._12_4_;
        auVar57._16_4_ = fVar187 * 0.0;
        auVar57._20_4_ = fVar191 * 0.0;
        auVar57._24_4_ = fVar186 * 0.0;
        auVar57._28_4_ = iVar1;
        auVar110 = vfmadd231ps_fma(auVar57,auVar128,ZEXT1632(auVar110));
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar129,ZEXT1632(auVar108));
        fVar191 = auVar114._0_4_;
        fVar186 = auVar114._4_4_;
        fVar187 = auVar114._8_4_;
        fVar188 = auVar114._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar110._12_4_ * fVar188,
                                       CONCAT48(auVar110._8_4_ * fVar187,
                                                CONCAT44(auVar110._4_4_ * fVar186,
                                                         auVar110._0_4_ * fVar191))));
        auVar228 = ZEXT3264(local_5a0);
        auVar175._4_4_ = local_760;
        auVar175._0_4_ = local_760;
        auVar175._8_4_ = local_760;
        auVar175._12_4_ = local_760;
        auVar175._16_4_ = local_760;
        auVar175._20_4_ = local_760;
        auVar175._24_4_ = local_760;
        auVar175._28_4_ = local_760;
        uVar189 = vcmpps_avx512vl(auVar175,local_5a0,2);
        uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar169;
        auVar34._0_4_ = uVar169;
        auVar34._8_4_ = uVar169;
        auVar34._12_4_ = uVar169;
        auVar34._16_4_ = uVar169;
        auVar34._20_4_ = uVar169;
        auVar34._24_4_ = uVar169;
        auVar34._28_4_ = uVar169;
        uVar28 = vcmpps_avx512vl(local_5a0,auVar34,2);
        bVar102 = (byte)uVar189 & (byte)uVar28 & bVar102;
        if (bVar102 != 0) {
          uVar103 = vcmpps_avx512vl(ZEXT1632(auVar109),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar103 = bVar102 & uVar103;
          if ((char)uVar103 != '\0') {
            fVar200 = auVar125._0_4_ * fVar191;
            fVar206 = auVar125._4_4_ * fVar186;
            auVar58._4_4_ = fVar206;
            auVar58._0_4_ = fVar200;
            fVar104 = auVar125._8_4_ * fVar187;
            auVar58._8_4_ = fVar104;
            fVar105 = auVar125._12_4_ * fVar188;
            auVar58._12_4_ = fVar105;
            fVar159 = auVar125._16_4_ * 0.0;
            auVar58._16_4_ = fVar159;
            fVar160 = auVar125._20_4_ * 0.0;
            auVar58._20_4_ = fVar160;
            fVar161 = auVar125._24_4_ * 0.0;
            auVar58._24_4_ = fVar161;
            auVar58._28_4_ = auVar125._28_4_;
            auVar176._8_4_ = 0x3f800000;
            auVar176._0_8_ = 0x3f8000003f800000;
            auVar176._12_4_ = 0x3f800000;
            auVar176._16_4_ = 0x3f800000;
            auVar176._20_4_ = 0x3f800000;
            auVar176._24_4_ = 0x3f800000;
            auVar176._28_4_ = 0x3f800000;
            auVar121 = vsubps_avx(auVar176,auVar58);
            local_5e0._0_4_ =
                 (float)((uint)(bVar91 & 1) * (int)fVar200 |
                        (uint)!(bool)(bVar91 & 1) * auVar121._0_4_);
            bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar13 * (int)fVar206 | (uint)!bVar13 * auVar121._4_4_);
            bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar13 * (int)fVar104 | (uint)!bVar13 * auVar121._8_4_);
            bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
            local_5e0._12_4_ =
                 (float)((uint)bVar13 * (int)fVar105 | (uint)!bVar13 * auVar121._12_4_);
            bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar13 * (int)fVar159 | (uint)!bVar13 * auVar121._16_4_);
            bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar121._20_4_);
            bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar13 * (int)fVar161 | (uint)!bVar13 * auVar121._24_4_);
            bVar13 = SUB81(uVar93 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar121._28_4_);
            auVar121 = vsubps_avx(ZEXT1632(auVar202),auVar116);
            auVar114 = vfmadd213ps_fma(auVar121,local_5e0,auVar116);
            uVar169 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar35._4_4_ = uVar169;
            auVar35._0_4_ = uVar169;
            auVar35._8_4_ = uVar169;
            auVar35._12_4_ = uVar169;
            auVar35._16_4_ = uVar169;
            auVar35._20_4_ = uVar169;
            auVar35._24_4_ = uVar169;
            auVar35._28_4_ = uVar169;
            auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar114._12_4_ + auVar114._12_4_,
                                                          CONCAT48(auVar114._8_4_ + auVar114._8_4_,
                                                                   CONCAT44(auVar114._4_4_ +
                                                                            auVar114._4_4_,
                                                                            auVar114._0_4_ +
                                                                            auVar114._0_4_)))),
                                       auVar35);
            uVar96 = vcmpps_avx512vl(local_5a0,auVar121,6);
            uVar103 = uVar103 & uVar96;
            bVar102 = (byte)uVar103;
            if (bVar102 != 0) {
              auVar198._0_4_ = auVar117._0_4_ * fVar191;
              auVar198._4_4_ = auVar117._4_4_ * fVar186;
              auVar198._8_4_ = auVar117._8_4_ * fVar187;
              auVar198._12_4_ = auVar117._12_4_ * fVar188;
              auVar198._16_4_ = auVar117._16_4_ * 0.0;
              auVar198._20_4_ = auVar117._20_4_ * 0.0;
              auVar198._24_4_ = auVar117._24_4_ * 0.0;
              auVar198._28_4_ = 0;
              auVar203._8_4_ = 0x3f800000;
              auVar203._0_8_ = 0x3f8000003f800000;
              auVar203._12_4_ = 0x3f800000;
              auVar203._16_4_ = 0x3f800000;
              auVar203._20_4_ = 0x3f800000;
              auVar203._24_4_ = 0x3f800000;
              auVar203._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar203,auVar198);
              auVar142._0_4_ =
                   (uint)(bVar91 & 1) * (int)auVar198._0_4_ |
                   (uint)!(bool)(bVar91 & 1) * auVar121._0_4_;
              bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
              auVar142._4_4_ = (uint)bVar13 * (int)auVar198._4_4_ | (uint)!bVar13 * auVar121._4_4_;
              bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
              auVar142._8_4_ = (uint)bVar13 * (int)auVar198._8_4_ | (uint)!bVar13 * auVar121._8_4_;
              bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
              auVar142._12_4_ =
                   (uint)bVar13 * (int)auVar198._12_4_ | (uint)!bVar13 * auVar121._12_4_;
              bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
              auVar142._16_4_ =
                   (uint)bVar13 * (int)auVar198._16_4_ | (uint)!bVar13 * auVar121._16_4_;
              bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
              auVar142._20_4_ =
                   (uint)bVar13 * (int)auVar198._20_4_ | (uint)!bVar13 * auVar121._20_4_;
              bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
              auVar142._24_4_ =
                   (uint)bVar13 * (int)auVar198._24_4_ | (uint)!bVar13 * auVar121._24_4_;
              auVar142._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar121._28_4_;
              auVar36._8_4_ = 0x40000000;
              auVar36._0_8_ = 0x4000000040000000;
              auVar36._12_4_ = 0x40000000;
              auVar36._16_4_ = 0x40000000;
              auVar36._20_4_ = 0x40000000;
              auVar36._24_4_ = 0x40000000;
              auVar36._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar142,auVar203,auVar36);
              local_580 = 0;
              local_560 = local_850;
              uStack_558 = uStack_848;
              local_550 = local_860;
              uStack_548 = uStack_858;
              local_540 = local_870;
              uStack_538 = uStack_868;
              if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar191 = 1.0 / auVar229._0_4_;
                local_520[0] = fVar191 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar191 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar191 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar191 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar191 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar191 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar191 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                auVar177._8_4_ = 0x7f800000;
                auVar177._0_8_ = 0x7f8000007f800000;
                auVar177._12_4_ = 0x7f800000;
                auVar177._16_4_ = 0x7f800000;
                auVar177._20_4_ = 0x7f800000;
                auVar177._24_4_ = 0x7f800000;
                auVar177._28_4_ = 0x7f800000;
                auVar121 = vblendmps_avx512vl(auVar177,local_5a0);
                auVar143._0_4_ =
                     (uint)(bVar102 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar102 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar103 >> 1) & 1);
                auVar143._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                auVar143._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar103 >> 3) & 1);
                auVar143._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar103 >> 4) & 1);
                auVar143._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar103 >> 5) & 1);
                auVar143._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar103 >> 6) & 1);
                auVar143._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar103 >> 7,0);
                auVar143._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar121 = vshufps_avx(auVar143,auVar143,0xb1);
                auVar121 = vminps_avx(auVar143,auVar121);
                auVar119 = vshufpd_avx(auVar121,auVar121,5);
                auVar121 = vminps_avx(auVar121,auVar119);
                auVar119 = vpermpd_avx2(auVar121,0x4e);
                auVar121 = vminps_avx(auVar121,auVar119);
                uVar189 = vcmpps_avx512vl(auVar143,auVar121,0);
                uVar94 = (uint)uVar103;
                if ((bVar102 & (byte)uVar189) != 0) {
                  uVar94 = (uint)(bVar102 & (byte)uVar189);
                }
                uVar95 = 0;
                for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                  uVar95 = uVar95 + 1;
                }
                uVar93 = (ulong)uVar95;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780 = *(undefined4 *)(ray + k * 4 + 0x200);
                  uStack_77c = 0;
                  uStack_778 = 0;
                  uStack_774 = 0;
                  local_7e0 = auVar115;
                  local_7c0 = local_5a0;
                  local_57c = iVar10;
                  local_570 = auVar106;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar93]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar93 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar93 * 4);
                    local_840.context = context->user;
                    fVar188 = local_200._0_4_;
                    fVar191 = 1.0 - fVar188;
                    auVar32._8_4_ = 0x80000000;
                    auVar32._0_8_ = 0x8000000080000000;
                    auVar32._12_4_ = 0x80000000;
                    auVar110 = vxorps_avx512vl(ZEXT416((uint)fVar191),auVar32);
                    auVar114 = ZEXT416((uint)(fVar188 * fVar191 * 4.0));
                    auVar109 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar114);
                    auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),
                                               auVar114);
                    auVar224 = ZEXT464(0x3f000000);
                    fVar191 = fVar191 * auVar110._0_4_ * 0.5;
                    fVar186 = auVar109._0_4_ * 0.5;
                    fVar187 = auVar114._0_4_ * 0.5;
                    fVar188 = fVar188 * fVar188 * 0.5;
                    auVar219._0_4_ = fVar188 * fVar3;
                    auVar219._4_4_ = fVar188 * fVar168;
                    auVar219._8_4_ = fVar188 * fVar184;
                    auVar219._12_4_ = fVar188 * fVar185;
                    auVar172._4_4_ = fVar187;
                    auVar172._0_4_ = fVar187;
                    auVar172._8_4_ = fVar187;
                    auVar172._12_4_ = fVar187;
                    auVar114 = vfmadd132ps_fma(auVar172,auVar219,auVar7);
                    auVar212._4_4_ = fVar186;
                    auVar212._0_4_ = fVar186;
                    auVar212._8_4_ = fVar186;
                    auVar212._12_4_ = fVar186;
                    auVar114 = vfmadd132ps_fma(auVar212,auVar114,auVar27);
                    auVar173._4_4_ = fVar191;
                    auVar173._0_4_ = fVar191;
                    auVar173._8_4_ = fVar191;
                    auVar173._12_4_ = fVar191;
                    auVar114 = vfmadd213ps_fma(auVar173,auVar106,auVar114);
                    auVar158 = vbroadcastss_avx512f(auVar114);
                    auVar217 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar217 = vpermps_avx512f(auVar217,ZEXT1664(auVar114));
                    auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar114));
                    local_2c0[0] = (RTCHitN)auVar158[0];
                    local_2c0[1] = (RTCHitN)auVar158[1];
                    local_2c0[2] = (RTCHitN)auVar158[2];
                    local_2c0[3] = (RTCHitN)auVar158[3];
                    local_2c0[4] = (RTCHitN)auVar158[4];
                    local_2c0[5] = (RTCHitN)auVar158[5];
                    local_2c0[6] = (RTCHitN)auVar158[6];
                    local_2c0[7] = (RTCHitN)auVar158[7];
                    local_2c0[8] = (RTCHitN)auVar158[8];
                    local_2c0[9] = (RTCHitN)auVar158[9];
                    local_2c0[10] = (RTCHitN)auVar158[10];
                    local_2c0[0xb] = (RTCHitN)auVar158[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar158[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar158[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar158[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar158[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar158[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar158[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar158[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar158[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar158[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar158[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar158[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar158[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar158[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar158[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar158[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar158[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar158[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar158[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar158[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar158[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar158[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar158[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar158[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar158[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar158[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar158[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar158[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar158[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar158[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar158[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar158[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar158[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar158[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar158[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar158[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar158[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar158[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar158[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar158[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar158[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar158[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar158[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar158[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar158[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar158[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar158[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar158[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar158[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar158[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar158[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar158[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar158[0x3f];
                    local_280 = auVar217;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar158 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar158);
                    auVar121 = vpcmpeqd_avx2(auVar158._0_32_,auVar158._0_32_);
                    local_7f0[3] = auVar121;
                    local_7f0[2] = auVar121;
                    local_7f0[1] = auVar121;
                    *local_7f0 = auVar121;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]));
                    auVar158 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar158);
                    local_840.valid = (int *)local_740;
                    local_840.geometryUserPtr = pGVar98->userPtr;
                    local_840.hit = local_2c0;
                    local_840.N = 0x10;
                    local_840.ray = (RTCRayN *)ray;
                    if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar217 = ZEXT1664(auVar217._0_16_);
                      auVar220 = ZEXT1664(auVar220._0_16_);
                      auVar224 = ZEXT1664(auVar224._0_16_);
                      (*pGVar98->intersectionFilterN)(&local_840);
                      auVar228 = ZEXT3264(local_7c0);
                      auVar157 = ZEXT3264(local_7e0);
                      auVar183 = ZEXT464(0x35000000);
                      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar237 = ZEXT1664(auVar114);
                      auVar121 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar236 = ZEXT3264(auVar121);
                      auVar158 = vmovdqa64_avx512f(local_740);
                      ray = local_7f8;
                    }
                    uVar189 = vptestmd_avx512f(auVar158,auVar158);
                    if ((short)uVar189 == 0) {
LAB_019f1933:
                      *(undefined4 *)(ray + k * 4 + 0x200) = local_780;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar217 = ZEXT1664(auVar217._0_16_);
                        auVar220 = ZEXT1664(auVar220._0_16_);
                        auVar224 = ZEXT1664(auVar224._0_16_);
                        (*p_Var12)(&local_840);
                        auVar228 = ZEXT3264(local_7c0);
                        auVar157 = ZEXT3264(local_7e0);
                        auVar183 = ZEXT464(0x35000000);
                        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar237 = ZEXT1664(auVar114);
                        auVar121 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar236 = ZEXT3264(auVar121);
                        auVar158 = vmovdqa64_avx512f(local_740);
                        ray = local_7f8;
                      }
                      uVar96 = vptestmd_avx512f(auVar158,auVar158);
                      if ((short)uVar96 == 0) goto LAB_019f1933;
                      iVar1 = *(int *)(local_840.hit + 4);
                      iVar2 = *(int *)(local_840.hit + 8);
                      iVar76 = *(int *)(local_840.hit + 0xc);
                      iVar77 = *(int *)(local_840.hit + 0x10);
                      iVar78 = *(int *)(local_840.hit + 0x14);
                      iVar79 = *(int *)(local_840.hit + 0x18);
                      iVar80 = *(int *)(local_840.hit + 0x1c);
                      iVar81 = *(int *)(local_840.hit + 0x20);
                      iVar82 = *(int *)(local_840.hit + 0x24);
                      iVar83 = *(int *)(local_840.hit + 0x28);
                      iVar84 = *(int *)(local_840.hit + 0x2c);
                      iVar85 = *(int *)(local_840.hit + 0x30);
                      iVar86 = *(int *)(local_840.hit + 0x34);
                      iVar87 = *(int *)(local_840.hit + 0x38);
                      iVar88 = *(int *)(local_840.hit + 0x3c);
                      bVar102 = (byte)uVar96;
                      bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                      bVar91 = (byte)(uVar96 >> 8);
                      bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                      bVar26 = SUB81(uVar96 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x300) =
                           (uint)(bVar102 & 1) * *(int *)local_840.hit |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x300);
                      *(uint *)(local_840.ray + 0x304) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x304);
                      *(uint *)(local_840.ray + 0x308) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x308);
                      *(uint *)(local_840.ray + 0x30c) =
                           (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_840.ray + 0x30c);
                      *(uint *)(local_840.ray + 0x310) =
                           (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_840.ray + 0x310);
                      *(uint *)(local_840.ray + 0x314) =
                           (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_840.ray + 0x314);
                      *(uint *)(local_840.ray + 0x318) =
                           (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_840.ray + 0x318);
                      *(uint *)(local_840.ray + 0x31c) =
                           (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x31c);
                      *(uint *)(local_840.ray + 800) =
                           (uint)(bVar91 & 1) * iVar81 |
                           (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 800);
                      *(uint *)(local_840.ray + 0x324) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x324);
                      *(uint *)(local_840.ray + 0x328) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x328);
                      *(uint *)(local_840.ray + 0x32c) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x32c);
                      *(uint *)(local_840.ray + 0x330) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x330);
                      *(uint *)(local_840.ray + 0x334) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x334);
                      *(uint *)(local_840.ray + 0x338) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x338);
                      *(uint *)(local_840.ray + 0x33c) =
                           (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x33c);
                      iVar1 = *(int *)(local_840.hit + 0x44);
                      iVar2 = *(int *)(local_840.hit + 0x48);
                      iVar76 = *(int *)(local_840.hit + 0x4c);
                      iVar77 = *(int *)(local_840.hit + 0x50);
                      iVar78 = *(int *)(local_840.hit + 0x54);
                      iVar79 = *(int *)(local_840.hit + 0x58);
                      iVar80 = *(int *)(local_840.hit + 0x5c);
                      iVar81 = *(int *)(local_840.hit + 0x60);
                      iVar82 = *(int *)(local_840.hit + 100);
                      iVar83 = *(int *)(local_840.hit + 0x68);
                      iVar84 = *(int *)(local_840.hit + 0x6c);
                      iVar85 = *(int *)(local_840.hit + 0x70);
                      iVar86 = *(int *)(local_840.hit + 0x74);
                      iVar87 = *(int *)(local_840.hit + 0x78);
                      iVar88 = *(int *)(local_840.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                      bVar26 = SUB81(uVar96 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x340) =
                           (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0x40) |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x340);
                      *(uint *)(local_840.ray + 0x344) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x344);
                      *(uint *)(local_840.ray + 0x348) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x348);
                      *(uint *)(local_840.ray + 0x34c) =
                           (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_840.ray + 0x34c);
                      *(uint *)(local_840.ray + 0x350) =
                           (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_840.ray + 0x350);
                      *(uint *)(local_840.ray + 0x354) =
                           (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_840.ray + 0x354);
                      *(uint *)(local_840.ray + 0x358) =
                           (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_840.ray + 0x358);
                      *(uint *)(local_840.ray + 0x35c) =
                           (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x35c);
                      *(uint *)(local_840.ray + 0x360) =
                           (uint)(bVar91 & 1) * iVar81 |
                           (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x360);
                      *(uint *)(local_840.ray + 0x364) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x364);
                      *(uint *)(local_840.ray + 0x368) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x368);
                      *(uint *)(local_840.ray + 0x36c) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x36c);
                      *(uint *)(local_840.ray + 0x370) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x370);
                      *(uint *)(local_840.ray + 0x374) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x374);
                      *(uint *)(local_840.ray + 0x378) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x378);
                      *(uint *)(local_840.ray + 0x37c) =
                           (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x37c);
                      iVar1 = *(int *)(local_840.hit + 0x84);
                      iVar2 = *(int *)(local_840.hit + 0x88);
                      iVar76 = *(int *)(local_840.hit + 0x8c);
                      iVar77 = *(int *)(local_840.hit + 0x90);
                      iVar78 = *(int *)(local_840.hit + 0x94);
                      iVar79 = *(int *)(local_840.hit + 0x98);
                      iVar80 = *(int *)(local_840.hit + 0x9c);
                      iVar81 = *(int *)(local_840.hit + 0xa0);
                      iVar82 = *(int *)(local_840.hit + 0xa4);
                      iVar83 = *(int *)(local_840.hit + 0xa8);
                      iVar84 = *(int *)(local_840.hit + 0xac);
                      iVar85 = *(int *)(local_840.hit + 0xb0);
                      iVar86 = *(int *)(local_840.hit + 0xb4);
                      iVar87 = *(int *)(local_840.hit + 0xb8);
                      iVar88 = *(int *)(local_840.hit + 0xbc);
                      bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                      bVar26 = SUB81(uVar96 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x380) =
                           (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0x80) |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x380);
                      *(uint *)(local_840.ray + 900) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 900);
                      *(uint *)(local_840.ray + 0x388) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x388);
                      *(uint *)(local_840.ray + 0x38c) =
                           (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_840.ray + 0x38c);
                      *(uint *)(local_840.ray + 0x390) =
                           (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_840.ray + 0x390);
                      *(uint *)(local_840.ray + 0x394) =
                           (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_840.ray + 0x394);
                      *(uint *)(local_840.ray + 0x398) =
                           (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_840.ray + 0x398);
                      *(uint *)(local_840.ray + 0x39c) =
                           (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x39c);
                      *(uint *)(local_840.ray + 0x3a0) =
                           (uint)(bVar91 & 1) * iVar81 |
                           (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x3a0);
                      *(uint *)(local_840.ray + 0x3a4) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3a4);
                      *(uint *)(local_840.ray + 0x3a8) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3a8);
                      *(uint *)(local_840.ray + 0x3ac) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3ac);
                      *(uint *)(local_840.ray + 0x3b0) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3b0);
                      *(uint *)(local_840.ray + 0x3b4) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3b4);
                      *(uint *)(local_840.ray + 0x3b8) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3b8);
                      *(uint *)(local_840.ray + 0x3bc) =
                           (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3bc);
                      iVar1 = *(int *)(local_840.hit + 0xc4);
                      iVar2 = *(int *)(local_840.hit + 200);
                      iVar76 = *(int *)(local_840.hit + 0xcc);
                      iVar77 = *(int *)(local_840.hit + 0xd0);
                      iVar78 = *(int *)(local_840.hit + 0xd4);
                      iVar79 = *(int *)(local_840.hit + 0xd8);
                      iVar80 = *(int *)(local_840.hit + 0xdc);
                      iVar81 = *(int *)(local_840.hit + 0xe0);
                      iVar82 = *(int *)(local_840.hit + 0xe4);
                      iVar83 = *(int *)(local_840.hit + 0xe8);
                      iVar84 = *(int *)(local_840.hit + 0xec);
                      iVar85 = *(int *)(local_840.hit + 0xf0);
                      iVar86 = *(int *)(local_840.hit + 0xf4);
                      iVar87 = *(int *)(local_840.hit + 0xf8);
                      iVar88 = *(int *)(local_840.hit + 0xfc);
                      bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                      bVar26 = SUB81(uVar96 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x3c0) =
                           (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0xc0) |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x3c0);
                      *(uint *)(local_840.ray + 0x3c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x3c4);
                      *(uint *)(local_840.ray + 0x3c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x3c8);
                      *(uint *)(local_840.ray + 0x3cc) =
                           (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_840.ray + 0x3cc);
                      *(uint *)(local_840.ray + 0x3d0) =
                           (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_840.ray + 0x3d0);
                      *(uint *)(local_840.ray + 0x3d4) =
                           (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_840.ray + 0x3d4);
                      *(uint *)(local_840.ray + 0x3d8) =
                           (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_840.ray + 0x3d8);
                      *(uint *)(local_840.ray + 0x3dc) =
                           (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3dc);
                      *(uint *)(local_840.ray + 0x3e0) =
                           (uint)(bVar91 & 1) * iVar81 |
                           (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x3e0);
                      *(uint *)(local_840.ray + 0x3e4) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3e4);
                      *(uint *)(local_840.ray + 1000) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 1000);
                      *(uint *)(local_840.ray + 0x3ec) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3ec);
                      *(uint *)(local_840.ray + 0x3f0) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3f0);
                      *(uint *)(local_840.ray + 0x3f4) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3f4);
                      *(uint *)(local_840.ray + 0x3f8) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3f8);
                      *(uint *)(local_840.ray + 0x3fc) =
                           (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3fc);
                      iVar1 = *(int *)(local_840.hit + 0x104);
                      iVar2 = *(int *)(local_840.hit + 0x108);
                      iVar76 = *(int *)(local_840.hit + 0x10c);
                      iVar77 = *(int *)(local_840.hit + 0x110);
                      iVar78 = *(int *)(local_840.hit + 0x114);
                      iVar79 = *(int *)(local_840.hit + 0x118);
                      iVar80 = *(int *)(local_840.hit + 0x11c);
                      iVar81 = *(int *)(local_840.hit + 0x120);
                      iVar82 = *(int *)(local_840.hit + 0x124);
                      iVar83 = *(int *)(local_840.hit + 0x128);
                      iVar84 = *(int *)(local_840.hit + 300);
                      iVar85 = *(int *)(local_840.hit + 0x130);
                      iVar86 = *(int *)(local_840.hit + 0x134);
                      iVar87 = *(int *)(local_840.hit + 0x138);
                      iVar88 = *(int *)(local_840.hit + 0x13c);
                      bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                      bVar26 = SUB81(uVar96 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x400) =
                           (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0x100) |
                           (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x400);
                      *(uint *)(local_840.ray + 0x404) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 0x404);
                      *(uint *)(local_840.ray + 0x408) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_840.ray + 0x408);
                      *(uint *)(local_840.ray + 0x40c) =
                           (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_840.ray + 0x40c);
                      *(uint *)(local_840.ray + 0x410) =
                           (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_840.ray + 0x410);
                      *(uint *)(local_840.ray + 0x414) =
                           (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_840.ray + 0x414);
                      *(uint *)(local_840.ray + 0x418) =
                           (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_840.ray + 0x418);
                      *(uint *)(local_840.ray + 0x41c) =
                           (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_840.ray + 0x41c);
                      *(uint *)(local_840.ray + 0x420) =
                           (uint)(bVar91 & 1) * iVar81 |
                           (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x420);
                      *(uint *)(local_840.ray + 0x424) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x424);
                      *(uint *)(local_840.ray + 0x428) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x428);
                      *(uint *)(local_840.ray + 0x42c) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x42c);
                      *(uint *)(local_840.ray + 0x430) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x430);
                      *(uint *)(local_840.ray + 0x434) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x434);
                      *(uint *)(local_840.ray + 0x438) =
                           (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x438);
                      *(uint *)(local_840.ray + 0x43c) =
                           (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x43c);
                      auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140));
                      auVar158 = vmovdqu32_avx512f(auVar158);
                      *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar158;
                      auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180));
                      auVar158 = vmovdqu32_avx512f(auVar158);
                      *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar158;
                      auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0));
                      auVar158 = vmovdqa32_avx512f(auVar158);
                      *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar158;
                      auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200));
                      auVar158 = vmovdqa32_avx512f(auVar158);
                      *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar158;
                      local_780 = *(undefined4 *)(ray + k * 4 + 0x200);
                      uStack_77c = 0;
                      uStack_778 = 0;
                      uStack_774 = 0;
                    }
                    auVar115 = auVar157._0_32_;
                    bVar102 = ~(byte)(1 << ((uint)uVar93 & 0x1f)) & (byte)uVar103;
                    auVar181._4_4_ = local_780;
                    auVar181._0_4_ = local_780;
                    auVar181._8_4_ = local_780;
                    auVar181._12_4_ = local_780;
                    auVar181._16_4_ = local_780;
                    auVar181._20_4_ = local_780;
                    auVar181._24_4_ = local_780;
                    auVar181._28_4_ = local_780;
                    uVar189 = vcmpps_avx512vl(auVar228._0_32_,auVar181,2);
                    if ((bVar102 & (byte)uVar189) == 0) goto LAB_019f07f7;
                    bVar102 = bVar102 & (byte)uVar189;
                    uVar103 = (ulong)bVar102;
                    auVar182._8_4_ = 0x7f800000;
                    auVar182._0_8_ = 0x7f8000007f800000;
                    auVar182._12_4_ = 0x7f800000;
                    auVar182._16_4_ = 0x7f800000;
                    auVar182._20_4_ = 0x7f800000;
                    auVar182._24_4_ = 0x7f800000;
                    auVar182._28_4_ = 0x7f800000;
                    auVar121 = vblendmps_avx512vl(auVar182,auVar228._0_32_);
                    auVar156._0_4_ =
                         (uint)(bVar102 & 1) * auVar121._0_4_ |
                         (uint)!(bool)(bVar102 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar102 >> 1 & 1);
                    auVar156._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar102 >> 2 & 1);
                    auVar156._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar102 >> 3 & 1);
                    auVar156._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar102 >> 4 & 1);
                    auVar156._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar102 >> 5 & 1);
                    auVar156._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar102 >> 6 & 1);
                    auVar156._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar156._28_4_ =
                         (uint)(bVar102 >> 7) * auVar121._28_4_ |
                         (uint)!(bool)(bVar102 >> 7) * 0x7f800000;
                    auVar121 = vshufps_avx(auVar156,auVar156,0xb1);
                    auVar121 = vminps_avx(auVar156,auVar121);
                    auVar119 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar119);
                    auVar119 = vpermpd_avx2(auVar121,0x4e);
                    auVar121 = vminps_avx(auVar121,auVar119);
                    uVar189 = vcmpps_avx512vl(auVar156,auVar121,0);
                    bVar91 = (byte)uVar189 & bVar102;
                    if (bVar91 != 0) {
                      bVar102 = bVar91;
                    }
                    uVar94 = 0;
                    for (uVar95 = (uint)bVar102; (uVar95 & 1) == 0;
                        uVar95 = uVar95 >> 1 | 0x80000000) {
                      uVar94 = uVar94 + 1;
                    }
                    uVar93 = (ulong)uVar94;
                  } while( true );
                }
                fVar191 = local_520[uVar93];
                uVar169 = *(undefined4 *)(local_500 + uVar93 * 4);
                fVar186 = 1.0 - fVar191;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar110 = vxorps_avx512vl(ZEXT416((uint)fVar186),auVar29);
                auVar114 = ZEXT416((uint)(fVar191 * fVar186 * 4.0));
                auVar109 = vfnmsub213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),auVar114);
                auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),auVar114);
                fVar186 = fVar186 * auVar110._0_4_ * 0.5;
                fVar187 = auVar109._0_4_ * 0.5;
                auVar220 = ZEXT464((uint)fVar187);
                fVar188 = auVar114._0_4_ * 0.5;
                fVar200 = fVar191 * fVar191 * 0.5;
                auVar207._0_4_ = fVar200 * fVar3;
                auVar207._4_4_ = fVar200 * fVar168;
                auVar207._8_4_ = fVar200 * fVar184;
                auVar207._12_4_ = fVar200 * fVar185;
                auVar194._4_4_ = fVar188;
                auVar194._0_4_ = fVar188;
                auVar194._8_4_ = fVar188;
                auVar194._12_4_ = fVar188;
                auVar114 = vfmadd132ps_fma(auVar194,auVar207,auVar7);
                auVar208._4_4_ = fVar187;
                auVar208._0_4_ = fVar187;
                auVar208._8_4_ = fVar187;
                auVar208._12_4_ = fVar187;
                auVar114 = vfmadd132ps_fma(auVar208,auVar114,auVar27);
                auVar217 = ZEXT1664(auVar114);
                auVar195._4_4_ = fVar186;
                auVar195._0_4_ = fVar186;
                auVar195._8_4_ = fVar186;
                auVar195._12_4_ = fVar186;
                auVar114 = vfmadd213ps_fma(auVar195,auVar106,auVar114);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar93 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar114._0_4_;
                uVar11 = vextractps_avx(auVar114,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar11;
                uVar11 = vextractps_avx(auVar114,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar11;
                *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar169;
                *(undefined4 *)(ray + k * 4 + 0x440) = uVar4;
                *(uint *)(ray + k * 4 + 0x480) = uVar9;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
            }
          }
        }
      }
    }
LAB_019f07f7:
    if (8 < iVar10) {
      auVar121 = vpbroadcastd_avx512vl();
      auVar157 = ZEXT3264(auVar121);
      local_780 = local_810._0_4_;
      uStack_77c = local_810._0_4_;
      uStack_778 = local_810._0_4_;
      uStack_774 = local_810._0_4_;
      uStack_770 = local_810._0_4_;
      uStack_76c = local_810._0_4_;
      uStack_768 = local_810._0_4_;
      uStack_764 = local_810._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_440 = 1.0 / (float)local_7a0._0_4_;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      lVar100 = 8;
      local_7e0 = auVar115;
LAB_019f087d:
      if (lVar100 < lVar97) {
        auVar121 = vpbroadcastd_avx512vl();
        auVar121 = vpor_avx2(auVar121,_DAT_01fb4ba0);
        uVar28 = vpcmpgtd_avx512vl(auVar157._0_32_,auVar121);
        auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar100 * 4 + lVar101);
        auVar119 = *(undefined1 (*) [32])(lVar101 + 0x21fffac + lVar100 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar101 + 0x2200430 + lVar100 * 4);
        auVar130 = *(undefined1 (*) [32])(lVar101 + 0x22008b4 + lVar100 * 4);
        auVar228._0_4_ = auVar130._0_4_ * (float)local_6c0._0_4_;
        auVar228._4_4_ = auVar130._4_4_ * (float)local_6c0._4_4_;
        auVar228._8_4_ = auVar130._8_4_ * fStack_6b8;
        auVar228._12_4_ = auVar130._12_4_ * fStack_6b4;
        auVar228._16_4_ = auVar130._16_4_ * fStack_6b0;
        auVar228._20_4_ = auVar130._20_4_ * fStack_6ac;
        auVar228._28_36_ = auVar220._28_36_;
        auVar228._24_4_ = auVar130._24_4_ * fStack_6a8;
        auVar220._0_4_ = auVar130._0_4_ * (float)local_6e0._0_4_;
        auVar220._4_4_ = auVar130._4_4_ * (float)local_6e0._4_4_;
        auVar220._8_4_ = auVar130._8_4_ * fStack_6d8;
        auVar220._12_4_ = auVar130._12_4_ * fStack_6d4;
        auVar220._16_4_ = auVar130._16_4_ * fStack_6d0;
        auVar220._20_4_ = auVar130._20_4_ * fStack_6cc;
        auVar220._28_36_ = auVar217._28_36_;
        auVar220._24_4_ = auVar130._24_4_ * fStack_6c8;
        auVar123 = vmulps_avx512vl(local_420,auVar130);
        auVar122 = vfmadd231ps_avx512vl(auVar228._0_32_,auVar120,local_680);
        auVar129 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar120,local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,local_400);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,local_640);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar119,local_660);
        auVar128 = vfmadd231ps_avx512vl(auVar123,auVar119,local_3e0);
        auVar114 = vfmadd231ps_fma(auVar122,auVar121,local_600);
        auVar220 = ZEXT1664(auVar114);
        auVar109 = vfmadd231ps_fma(auVar129,auVar121,local_620);
        auVar217 = ZEXT1664(auVar109);
        auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar100 * 4 + lVar101);
        auVar122 = *(undefined1 (*) [32])(lVar101 + 0x22023cc + lVar100 * 4);
        auVar117 = vfmadd231ps_avx512vl(auVar128,auVar121,local_3c0);
        auVar129 = *(undefined1 (*) [32])(lVar101 + 0x2202850 + lVar100 * 4);
        auVar128 = *(undefined1 (*) [32])(lVar101 + 0x2202cd4 + lVar100 * 4);
        auVar158._0_4_ = auVar128._0_4_ * (float)local_6c0._0_4_;
        auVar158._4_4_ = auVar128._4_4_ * (float)local_6c0._4_4_;
        auVar158._8_4_ = auVar128._8_4_ * fStack_6b8;
        auVar158._12_4_ = auVar128._12_4_ * fStack_6b4;
        auVar158._16_4_ = auVar128._16_4_ * fStack_6b0;
        auVar158._20_4_ = auVar128._20_4_ * fStack_6ac;
        auVar158._28_36_ = auVar224._28_36_;
        auVar158._24_4_ = auVar128._24_4_ * fStack_6a8;
        auVar59._4_4_ = auVar128._4_4_ * (float)local_6e0._4_4_;
        auVar59._0_4_ = auVar128._0_4_ * (float)local_6e0._0_4_;
        auVar59._8_4_ = auVar128._8_4_ * fStack_6d8;
        auVar59._12_4_ = auVar128._12_4_ * fStack_6d4;
        auVar59._16_4_ = auVar128._16_4_ * fStack_6d0;
        auVar59._20_4_ = auVar128._20_4_ * fStack_6cc;
        auVar59._24_4_ = auVar128._24_4_ * fStack_6c8;
        auVar59._28_4_ = uStack_6c4;
        auVar124 = vmulps_avx512vl(local_420,auVar128);
        auVar125 = vfmadd231ps_avx512vl(auVar158._0_32_,auVar129,local_680);
        auVar118 = vfmadd231ps_avx512vl(auVar59,auVar129,local_6a0);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar129,local_400);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar122,local_640);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar122,local_660);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar122,local_3e0);
        auVar110 = vfmadd231ps_fma(auVar125,auVar123,local_600);
        auVar224 = ZEXT1664(auVar110);
        auVar108 = vfmadd231ps_fma(auVar118,auVar123,local_620);
        auVar118 = vfmadd231ps_avx512vl(auVar124,auVar123,local_3c0);
        auVar115 = vmaxps_avx512vl(auVar117,auVar118);
        auVar124 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar114));
        auVar125 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar109));
        auVar116 = vmulps_avx512vl(ZEXT1632(auVar109),auVar124);
        auVar126 = vmulps_avx512vl(ZEXT1632(auVar114),auVar125);
        auVar116 = vsubps_avx512vl(auVar116,auVar126);
        auVar126 = vmulps_avx512vl(auVar125,auVar125);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar124,auVar124);
        auVar115 = vmulps_avx512vl(auVar115,auVar115);
        auVar115 = vmulps_avx512vl(auVar115,auVar126);
        auVar116 = vmulps_avx512vl(auVar116,auVar116);
        uVar189 = vcmpps_avx512vl(auVar116,auVar115,2);
        bVar102 = (byte)uVar28 & (byte)uVar189;
        if (bVar102 != 0) {
          auVar128 = vmulps_avx512vl(local_4c0,auVar128);
          auVar129 = vfmadd213ps_avx512vl(auVar129,local_4a0,auVar128);
          auVar122 = vfmadd213ps_avx512vl(auVar122,local_480,auVar129);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_7e0,auVar122);
          auVar130 = vmulps_avx512vl(local_4c0,auVar130);
          auVar120 = vfmadd213ps_avx512vl(auVar120,local_4a0,auVar130);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_480,auVar120);
          auVar122 = vfmadd213ps_avx512vl(auVar121,local_7e0,auVar119);
          auVar121 = *(undefined1 (*) [32])(lVar101 + 0x2200d38 + lVar100 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar101 + 0x22011bc + lVar100 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar101 + 0x2201640 + lVar100 * 4);
          auVar130 = *(undefined1 (*) [32])(lVar101 + 0x2201ac4 + lVar100 * 4);
          auVar129 = vmulps_avx512vl(_local_6c0,auVar130);
          auVar128 = vmulps_avx512vl(_local_6e0,auVar130);
          auVar130 = vmulps_avx512vl(local_4c0,auVar130);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar120,local_680);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar120,local_6a0);
          auVar120 = vfmadd231ps_avx512vl(auVar130,local_4a0,auVar120);
          auVar130 = vfmadd231ps_avx512vl(auVar129,auVar119,local_640);
          auVar129 = vfmadd231ps_avx512vl(auVar128,auVar119,local_660);
          auVar119 = vfmadd231ps_avx512vl(auVar120,local_480,auVar119);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar121,local_600);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar121,local_620);
          auVar107 = vfmadd231ps_fma(auVar119,auVar121,local_7e0);
          auVar121 = *(undefined1 (*) [32])(lVar101 + 0x2203158 + lVar100 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar101 + 0x2203a60 + lVar100 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar101 + 0x2203ee4 + lVar100 * 4);
          auVar128 = vmulps_avx512vl(_local_6c0,auVar120);
          auVar115 = vmulps_avx512vl(_local_6e0,auVar120);
          auVar120 = vmulps_avx512vl(local_4c0,auVar120);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar119,local_680);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_6a0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,local_4a0,auVar119);
          auVar119 = *(undefined1 (*) [32])(lVar101 + 0x22035dc + lVar100 * 4);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar119,local_640);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_660);
          auVar119 = vfmadd231ps_avx512vl(auVar120,local_480,auVar119);
          auVar120 = vfmadd231ps_avx512vl(auVar128,auVar121,local_600);
          auVar128 = vfmadd231ps_avx512vl(auVar115,auVar121,local_620);
          auVar119 = vfmadd231ps_avx512vl(auVar119,local_7e0,auVar121);
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar130,auVar115);
          vandps_avx512vl(auVar129,auVar115);
          auVar121 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(ZEXT1632(auVar107),auVar115);
          auVar121 = vmaxps_avx(auVar121,auVar115);
          auVar89._4_4_ = uStack_77c;
          auVar89._0_4_ = local_780;
          auVar89._8_4_ = uStack_778;
          auVar89._12_4_ = uStack_774;
          auVar89._16_4_ = uStack_770;
          auVar89._20_4_ = uStack_76c;
          auVar89._24_4_ = uStack_768;
          auVar89._28_4_ = uStack_764;
          uVar93 = vcmpps_avx512vl(auVar121,auVar89,1);
          bVar13 = (bool)((byte)uVar93 & 1);
          auVar144._0_4_ = (float)((uint)bVar13 * auVar124._0_4_ | (uint)!bVar13 * auVar130._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * auVar130._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * auVar130._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar144._12_4_ =
               (float)((uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * auVar130._12_4_);
          bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar144._16_4_ =
               (float)((uint)bVar13 * auVar124._16_4_ | (uint)!bVar13 * auVar130._16_4_);
          bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar144._20_4_ =
               (float)((uint)bVar13 * auVar124._20_4_ | (uint)!bVar13 * auVar130._20_4_);
          bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar144._24_4_ =
               (float)((uint)bVar13 * auVar124._24_4_ | (uint)!bVar13 * auVar130._24_4_);
          bVar13 = SUB81(uVar93 >> 7,0);
          auVar144._28_4_ = (uint)bVar13 * auVar124._28_4_ | (uint)!bVar13 * auVar130._28_4_;
          bVar13 = (bool)((byte)uVar93 & 1);
          auVar145._0_4_ = (float)((uint)bVar13 * auVar125._0_4_ | (uint)!bVar13 * auVar129._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar129._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar129._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar129._12_4_);
          bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar145._16_4_ =
               (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar129._16_4_);
          bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar145._20_4_ =
               (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar129._20_4_);
          bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar145._24_4_ =
               (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar129._24_4_);
          bVar13 = SUB81(uVar93 >> 7,0);
          auVar145._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar129._28_4_;
          vandps_avx512vl(auVar120,auVar115);
          vandps_avx512vl(auVar128,auVar115);
          auVar121 = vmaxps_avx(auVar145,auVar145);
          vandps_avx512vl(auVar119,auVar115);
          auVar121 = vmaxps_avx(auVar121,auVar145);
          uVar93 = vcmpps_avx512vl(auVar121,auVar89,1);
          bVar13 = (bool)((byte)uVar93 & 1);
          auVar146._0_4_ = (uint)bVar13 * auVar124._0_4_ | (uint)!bVar13 * auVar120._0_4_;
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar146._4_4_ = (uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * auVar120._4_4_;
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar146._8_4_ = (uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * auVar120._8_4_;
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar146._12_4_ = (uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * auVar120._12_4_;
          bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar146._16_4_ = (uint)bVar13 * auVar124._16_4_ | (uint)!bVar13 * auVar120._16_4_;
          bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar146._20_4_ = (uint)bVar13 * auVar124._20_4_ | (uint)!bVar13 * auVar120._20_4_;
          bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar146._24_4_ = (uint)bVar13 * auVar124._24_4_ | (uint)!bVar13 * auVar120._24_4_;
          bVar13 = SUB81(uVar93 >> 7,0);
          auVar146._28_4_ = (uint)bVar13 * auVar124._28_4_ | (uint)!bVar13 * auVar120._28_4_;
          bVar13 = (bool)((byte)uVar93 & 1);
          auVar147._0_4_ = (float)((uint)bVar13 * auVar125._0_4_ | (uint)!bVar13 * auVar128._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar147._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar128._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar147._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar128._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar147._12_4_ =
               (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar128._12_4_);
          bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar147._16_4_ =
               (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar128._16_4_);
          bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar147._20_4_ =
               (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar128._20_4_);
          bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar147._24_4_ =
               (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar128._24_4_);
          bVar13 = SUB81(uVar93 >> 7,0);
          auVar147._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar128._28_4_;
          auVar227._8_4_ = 0x80000000;
          auVar227._0_8_ = 0x8000000080000000;
          auVar227._12_4_ = 0x80000000;
          auVar227._16_4_ = 0x80000000;
          auVar227._20_4_ = 0x80000000;
          auVar227._24_4_ = 0x80000000;
          auVar227._28_4_ = 0x80000000;
          auVar121 = vxorps_avx512vl(auVar146,auVar227);
          auVar113 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
          auVar119 = vfmadd213ps_avx512vl(auVar144,auVar144,ZEXT1632(auVar113));
          auVar107 = vfmadd231ps_fma(auVar119,auVar145,auVar145);
          auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar107));
          auVar235._8_4_ = 0xbf000000;
          auVar235._0_8_ = 0xbf000000bf000000;
          auVar235._12_4_ = 0xbf000000;
          auVar235._16_4_ = 0xbf000000;
          auVar235._20_4_ = 0xbf000000;
          auVar235._24_4_ = 0xbf000000;
          auVar235._28_4_ = 0xbf000000;
          fVar191 = auVar119._0_4_;
          fVar186 = auVar119._4_4_;
          fVar187 = auVar119._8_4_;
          fVar188 = auVar119._12_4_;
          fVar200 = auVar119._16_4_;
          fVar206 = auVar119._20_4_;
          fVar104 = auVar119._24_4_;
          auVar60._4_4_ = fVar186 * fVar186 * fVar186 * auVar107._4_4_ * -0.5;
          auVar60._0_4_ = fVar191 * fVar191 * fVar191 * auVar107._0_4_ * -0.5;
          auVar60._8_4_ = fVar187 * fVar187 * fVar187 * auVar107._8_4_ * -0.5;
          auVar60._12_4_ = fVar188 * fVar188 * fVar188 * auVar107._12_4_ * -0.5;
          auVar60._16_4_ = fVar200 * fVar200 * fVar200 * -0.0;
          auVar60._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
          auVar60._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
          auVar60._28_4_ = auVar145._28_4_;
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar119 = vfmadd231ps_avx512vl(auVar60,auVar120,auVar119);
          auVar61._4_4_ = auVar145._4_4_ * auVar119._4_4_;
          auVar61._0_4_ = auVar145._0_4_ * auVar119._0_4_;
          auVar61._8_4_ = auVar145._8_4_ * auVar119._8_4_;
          auVar61._12_4_ = auVar145._12_4_ * auVar119._12_4_;
          auVar61._16_4_ = auVar145._16_4_ * auVar119._16_4_;
          auVar61._20_4_ = auVar145._20_4_ * auVar119._20_4_;
          auVar61._24_4_ = auVar145._24_4_ * auVar119._24_4_;
          auVar61._28_4_ = 0;
          auVar62._4_4_ = auVar119._4_4_ * -auVar144._4_4_;
          auVar62._0_4_ = auVar119._0_4_ * -auVar144._0_4_;
          auVar62._8_4_ = auVar119._8_4_ * -auVar144._8_4_;
          auVar62._12_4_ = auVar119._12_4_ * -auVar144._12_4_;
          auVar62._16_4_ = auVar119._16_4_ * -auVar144._16_4_;
          auVar62._20_4_ = auVar119._20_4_ * -auVar144._20_4_;
          auVar62._24_4_ = auVar119._24_4_ * -auVar144._24_4_;
          auVar62._28_4_ = auVar145._28_4_;
          auVar130 = vmulps_avx512vl(auVar119,ZEXT1632(auVar113));
          auVar128 = ZEXT1632(auVar113);
          auVar119 = vfmadd213ps_avx512vl(auVar146,auVar146,auVar128);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar147,auVar147);
          auVar129 = vrsqrt14ps_avx512vl(auVar119);
          auVar119 = vmulps_avx512vl(auVar119,auVar235);
          fVar191 = auVar129._0_4_;
          fVar186 = auVar129._4_4_;
          fVar187 = auVar129._8_4_;
          fVar188 = auVar129._12_4_;
          fVar200 = auVar129._16_4_;
          fVar206 = auVar129._20_4_;
          fVar104 = auVar129._24_4_;
          auVar63._4_4_ = fVar186 * fVar186 * fVar186 * auVar119._4_4_;
          auVar63._0_4_ = fVar191 * fVar191 * fVar191 * auVar119._0_4_;
          auVar63._8_4_ = fVar187 * fVar187 * fVar187 * auVar119._8_4_;
          auVar63._12_4_ = fVar188 * fVar188 * fVar188 * auVar119._12_4_;
          auVar63._16_4_ = fVar200 * fVar200 * fVar200 * auVar119._16_4_;
          auVar63._20_4_ = fVar206 * fVar206 * fVar206 * auVar119._20_4_;
          auVar63._24_4_ = fVar104 * fVar104 * fVar104 * auVar119._24_4_;
          auVar63._28_4_ = auVar119._28_4_;
          auVar119 = vfmadd231ps_avx512vl(auVar63,auVar120,auVar129);
          auVar64._4_4_ = auVar147._4_4_ * auVar119._4_4_;
          auVar64._0_4_ = auVar147._0_4_ * auVar119._0_4_;
          auVar64._8_4_ = auVar147._8_4_ * auVar119._8_4_;
          auVar64._12_4_ = auVar147._12_4_ * auVar119._12_4_;
          auVar64._16_4_ = auVar147._16_4_ * auVar119._16_4_;
          auVar64._20_4_ = auVar147._20_4_ * auVar119._20_4_;
          auVar64._24_4_ = auVar147._24_4_ * auVar119._24_4_;
          auVar64._28_4_ = auVar129._28_4_;
          auVar65._4_4_ = auVar119._4_4_ * auVar121._4_4_;
          auVar65._0_4_ = auVar119._0_4_ * auVar121._0_4_;
          auVar65._8_4_ = auVar119._8_4_ * auVar121._8_4_;
          auVar65._12_4_ = auVar119._12_4_ * auVar121._12_4_;
          auVar65._16_4_ = auVar119._16_4_ * auVar121._16_4_;
          auVar65._20_4_ = auVar119._20_4_ * auVar121._20_4_;
          auVar65._24_4_ = auVar119._24_4_ * auVar121._24_4_;
          auVar65._28_4_ = auVar121._28_4_;
          auVar121 = vmulps_avx512vl(auVar119,auVar128);
          auVar107 = vfmadd213ps_fma(auVar61,auVar117,ZEXT1632(auVar114));
          auVar8 = vfmadd213ps_fma(auVar62,auVar117,ZEXT1632(auVar109));
          auVar120 = vfmadd213ps_avx512vl(auVar130,auVar117,auVar122);
          auVar129 = vfmadd213ps_avx512vl(auVar64,auVar118,ZEXT1632(auVar110));
          auVar193 = vfnmadd213ps_fma(auVar61,auVar117,ZEXT1632(auVar114));
          auVar114 = vfmadd213ps_fma(auVar65,auVar118,ZEXT1632(auVar108));
          auVar201 = vfnmadd213ps_fma(auVar62,auVar117,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar121,auVar118,auVar123);
          auVar225 = vfnmadd231ps_fma(auVar122,auVar117,auVar130);
          auVar202 = vfnmadd213ps_fma(auVar64,auVar118,ZEXT1632(auVar110));
          auVar111 = vfnmadd213ps_fma(auVar65,auVar118,ZEXT1632(auVar108));
          auVar112 = vfnmadd231ps_fma(auVar123,auVar118,auVar121);
          auVar123 = vsubps_avx512vl(auVar129,ZEXT1632(auVar193));
          auVar121 = vsubps_avx(ZEXT1632(auVar114),ZEXT1632(auVar201));
          auVar119 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar225));
          auVar66._4_4_ = auVar121._4_4_ * auVar225._4_4_;
          auVar66._0_4_ = auVar121._0_4_ * auVar225._0_4_;
          auVar66._8_4_ = auVar121._8_4_ * auVar225._8_4_;
          auVar66._12_4_ = auVar121._12_4_ * auVar225._12_4_;
          auVar66._16_4_ = auVar121._16_4_ * 0.0;
          auVar66._20_4_ = auVar121._20_4_ * 0.0;
          auVar66._24_4_ = auVar121._24_4_ * 0.0;
          auVar66._28_4_ = auVar130._28_4_;
          auVar110 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar201),auVar119);
          auVar67._4_4_ = auVar119._4_4_ * auVar193._4_4_;
          auVar67._0_4_ = auVar119._0_4_ * auVar193._0_4_;
          auVar67._8_4_ = auVar119._8_4_ * auVar193._8_4_;
          auVar67._12_4_ = auVar119._12_4_ * auVar193._12_4_;
          auVar67._16_4_ = auVar119._16_4_ * 0.0;
          auVar67._20_4_ = auVar119._20_4_ * 0.0;
          auVar67._24_4_ = auVar119._24_4_ * 0.0;
          auVar67._28_4_ = auVar119._28_4_;
          auVar108 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar225),auVar123);
          auVar68._4_4_ = auVar201._4_4_ * auVar123._4_4_;
          auVar68._0_4_ = auVar201._0_4_ * auVar123._0_4_;
          auVar68._8_4_ = auVar201._8_4_ * auVar123._8_4_;
          auVar68._12_4_ = auVar201._12_4_ * auVar123._12_4_;
          auVar68._16_4_ = auVar123._16_4_ * 0.0;
          auVar68._20_4_ = auVar123._20_4_ * 0.0;
          auVar68._24_4_ = auVar123._24_4_ * 0.0;
          auVar68._28_4_ = auVar123._28_4_;
          auVar192 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar193),auVar121);
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar192),auVar128,ZEXT1632(auVar108));
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar128,ZEXT1632(auVar110));
          auVar116 = ZEXT1632(auVar113);
          uVar93 = vcmpps_avx512vl(auVar121,auVar116,2);
          bVar91 = (byte)uVar93;
          fVar160 = (float)((uint)(bVar91 & 1) * auVar107._0_4_ |
                           (uint)!(bool)(bVar91 & 1) * auVar202._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          fVar162 = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar202._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          fVar165 = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar202._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          fVar166 = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar202._12_4_);
          auVar128 = ZEXT1632(CONCAT412(fVar166,CONCAT48(fVar165,CONCAT44(fVar162,fVar160))));
          fVar161 = (float)((uint)(bVar91 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar91 & 1) * auVar111._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          fVar164 = (float)((uint)bVar13 * auVar8._4_4_ | (uint)!bVar13 * auVar111._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          fVar163 = (float)((uint)bVar13 * auVar8._8_4_ | (uint)!bVar13 * auVar111._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          fVar167 = (float)((uint)bVar13 * auVar8._12_4_ | (uint)!bVar13 * auVar111._12_4_);
          auVar124 = ZEXT1632(CONCAT412(fVar167,CONCAT48(fVar163,CONCAT44(fVar164,fVar161))));
          auVar148._0_4_ =
               (float)((uint)(bVar91 & 1) * auVar120._0_4_ |
                      (uint)!(bool)(bVar91 & 1) * auVar112._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar148._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar112._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar148._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar112._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar148._12_4_ =
               (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar112._12_4_);
          fVar187 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar120._16_4_);
          auVar148._16_4_ = fVar187;
          fVar191 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar120._20_4_);
          auVar148._20_4_ = fVar191;
          fVar186 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar120._24_4_);
          auVar148._24_4_ = fVar186;
          iVar1 = (uint)(byte)(uVar93 >> 7) * auVar120._28_4_;
          auVar148._28_4_ = iVar1;
          auVar121 = vblendmps_avx512vl(ZEXT1632(auVar193),auVar129);
          auVar149._0_4_ =
               (uint)(bVar91 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar110._0_4_;
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar149._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar110._4_4_;
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar149._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar110._8_4_;
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar149._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar110._12_4_;
          auVar149._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar121._16_4_;
          auVar149._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar121._20_4_;
          auVar149._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar121._24_4_;
          auVar149._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar121._28_4_;
          auVar121 = vblendmps_avx512vl(ZEXT1632(auVar201),ZEXT1632(auVar114));
          auVar150._0_4_ =
               (float)((uint)(bVar91 & 1) * auVar121._0_4_ |
                      (uint)!(bool)(bVar91 & 1) * auVar107._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar150._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar107._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar150._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar107._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar150._12_4_ =
               (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar107._12_4_);
          fVar200 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar121._16_4_);
          auVar150._16_4_ = fVar200;
          fVar188 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar121._20_4_);
          auVar150._20_4_ = fVar188;
          fVar206 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar121._24_4_);
          auVar150._24_4_ = fVar206;
          auVar150._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar121._28_4_;
          auVar121 = vblendmps_avx512vl(ZEXT1632(auVar225),ZEXT1632(auVar109));
          auVar151._0_4_ =
               (float)((uint)(bVar91 & 1) * auVar121._0_4_ |
                      (uint)!(bool)(bVar91 & 1) * auVar8._0_4_);
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar151._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar8._4_4_);
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar151._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar8._8_4_);
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar151._12_4_ = (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar8._12_4_);
          fVar104 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar121._16_4_);
          auVar151._16_4_ = fVar104;
          fVar159 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar121._20_4_);
          auVar151._20_4_ = fVar159;
          fVar105 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar121._24_4_);
          auVar151._24_4_ = fVar105;
          iVar2 = (uint)(byte)(uVar93 >> 7) * auVar121._28_4_;
          auVar151._28_4_ = iVar2;
          auVar152._0_4_ =
               (uint)(bVar91 & 1) * (int)auVar193._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar129._0_4_
          ;
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar152._4_4_ = (uint)bVar13 * (int)auVar193._4_4_ | (uint)!bVar13 * auVar129._4_4_;
          bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar152._8_4_ = (uint)bVar13 * (int)auVar193._8_4_ | (uint)!bVar13 * auVar129._8_4_;
          bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar152._12_4_ = (uint)bVar13 * (int)auVar193._12_4_ | (uint)!bVar13 * auVar129._12_4_;
          auVar152._16_4_ = (uint)!(bool)((byte)(uVar93 >> 4) & 1) * auVar129._16_4_;
          auVar152._20_4_ = (uint)!(bool)((byte)(uVar93 >> 5) & 1) * auVar129._20_4_;
          auVar152._24_4_ = (uint)!(bool)((byte)(uVar93 >> 6) & 1) * auVar129._24_4_;
          auVar152._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar129._28_4_;
          bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar93 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar129 = vsubps_avx512vl(auVar152,auVar128);
          auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar201._12_4_ |
                                                   (uint)!bVar17 * auVar114._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar201._8_4_ |
                                                            (uint)!bVar15 * auVar114._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar201._4_4_ |
                                                                     (uint)!bVar13 * auVar114._4_4_,
                                                                     (uint)(bVar91 & 1) *
                                                                     (int)auVar201._0_4_ |
                                                                     (uint)!(bool)(bVar91 & 1) *
                                                                     auVar114._0_4_)))),auVar124);
          auVar220 = ZEXT3264(auVar119);
          auVar120 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar225._12_4_ |
                                                   (uint)!bVar18 * auVar109._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar225._8_4_ |
                                                            (uint)!bVar16 * auVar109._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar225._4_4_ |
                                                                     (uint)!bVar14 * auVar109._4_4_,
                                                                     (uint)(bVar91 & 1) *
                                                                     (int)auVar225._0_4_ |
                                                                     (uint)!(bool)(bVar91 & 1) *
                                                                     auVar109._0_4_)))),auVar148);
          auVar130 = vsubps_avx(auVar128,auVar149);
          auVar224 = ZEXT3264(auVar130);
          auVar123 = vsubps_avx(auVar124,auVar150);
          auVar122 = vsubps_avx(auVar148,auVar151);
          auVar69._4_4_ = auVar120._4_4_ * fVar162;
          auVar69._0_4_ = auVar120._0_4_ * fVar160;
          auVar69._8_4_ = auVar120._8_4_ * fVar165;
          auVar69._12_4_ = auVar120._12_4_ * fVar166;
          auVar69._16_4_ = auVar120._16_4_ * 0.0;
          auVar69._20_4_ = auVar120._20_4_ * 0.0;
          auVar69._24_4_ = auVar120._24_4_ * 0.0;
          auVar69._28_4_ = 0;
          auVar114 = vfmsub231ps_fma(auVar69,auVar148,auVar129);
          auVar204._0_4_ = fVar161 * auVar129._0_4_;
          auVar204._4_4_ = fVar164 * auVar129._4_4_;
          auVar204._8_4_ = fVar163 * auVar129._8_4_;
          auVar204._12_4_ = fVar167 * auVar129._12_4_;
          auVar204._16_4_ = auVar129._16_4_ * 0.0;
          auVar204._20_4_ = auVar129._20_4_ * 0.0;
          auVar204._24_4_ = auVar129._24_4_ * 0.0;
          auVar204._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar204,auVar128,auVar119);
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar116,ZEXT1632(auVar114));
          auVar215._0_4_ = auVar119._0_4_ * auVar148._0_4_;
          auVar215._4_4_ = auVar119._4_4_ * auVar148._4_4_;
          auVar215._8_4_ = auVar119._8_4_ * auVar148._8_4_;
          auVar215._12_4_ = auVar119._12_4_ * auVar148._12_4_;
          auVar215._16_4_ = auVar119._16_4_ * fVar187;
          auVar215._20_4_ = auVar119._20_4_ * fVar191;
          auVar215._24_4_ = auVar119._24_4_ * fVar186;
          auVar215._28_4_ = 0;
          auVar114 = vfmsub231ps_fma(auVar215,auVar124,auVar120);
          auVar125 = vfmadd231ps_avx512vl(auVar121,auVar116,ZEXT1632(auVar114));
          auVar121 = vmulps_avx512vl(auVar122,auVar149);
          auVar121 = vfmsub231ps_avx512vl(auVar121,auVar130,auVar151);
          auVar70._4_4_ = auVar123._4_4_ * auVar151._4_4_;
          auVar70._0_4_ = auVar123._0_4_ * auVar151._0_4_;
          auVar70._8_4_ = auVar123._8_4_ * auVar151._8_4_;
          auVar70._12_4_ = auVar123._12_4_ * auVar151._12_4_;
          auVar70._16_4_ = auVar123._16_4_ * fVar104;
          auVar70._20_4_ = auVar123._20_4_ * fVar159;
          auVar70._24_4_ = auVar123._24_4_ * fVar105;
          auVar70._28_4_ = iVar2;
          auVar114 = vfmsub231ps_fma(auVar70,auVar150,auVar122);
          auVar216._0_4_ = auVar150._0_4_ * auVar130._0_4_;
          auVar216._4_4_ = auVar150._4_4_ * auVar130._4_4_;
          auVar216._8_4_ = auVar150._8_4_ * auVar130._8_4_;
          auVar216._12_4_ = auVar150._12_4_ * auVar130._12_4_;
          auVar216._16_4_ = fVar200 * auVar130._16_4_;
          auVar216._20_4_ = fVar188 * auVar130._20_4_;
          auVar216._24_4_ = fVar206 * auVar130._24_4_;
          auVar216._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar216,auVar123,auVar149);
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar116,auVar121);
          auVar115 = vfmadd231ps_avx512vl(auVar121,auVar116,ZEXT1632(auVar114));
          auVar217 = ZEXT3264(auVar115);
          auVar121 = vmaxps_avx(auVar125,auVar115);
          uVar189 = vcmpps_avx512vl(auVar121,auVar116,2);
          bVar102 = bVar102 & (byte)uVar189;
          if (bVar102 != 0) {
            auVar71._4_4_ = auVar122._4_4_ * auVar119._4_4_;
            auVar71._0_4_ = auVar122._0_4_ * auVar119._0_4_;
            auVar71._8_4_ = auVar122._8_4_ * auVar119._8_4_;
            auVar71._12_4_ = auVar122._12_4_ * auVar119._12_4_;
            auVar71._16_4_ = auVar122._16_4_ * auVar119._16_4_;
            auVar71._20_4_ = auVar122._20_4_ * auVar119._20_4_;
            auVar71._24_4_ = auVar122._24_4_ * auVar119._24_4_;
            auVar71._28_4_ = auVar121._28_4_;
            auVar108 = vfmsub231ps_fma(auVar71,auVar123,auVar120);
            auVar72._4_4_ = auVar120._4_4_ * auVar130._4_4_;
            auVar72._0_4_ = auVar120._0_4_ * auVar130._0_4_;
            auVar72._8_4_ = auVar120._8_4_ * auVar130._8_4_;
            auVar72._12_4_ = auVar120._12_4_ * auVar130._12_4_;
            auVar72._16_4_ = auVar120._16_4_ * auVar130._16_4_;
            auVar72._20_4_ = auVar120._20_4_ * auVar130._20_4_;
            auVar72._24_4_ = auVar120._24_4_ * auVar130._24_4_;
            auVar72._28_4_ = auVar120._28_4_;
            auVar110 = vfmsub231ps_fma(auVar72,auVar129,auVar122);
            auVar73._4_4_ = auVar123._4_4_ * auVar129._4_4_;
            auVar73._0_4_ = auVar123._0_4_ * auVar129._0_4_;
            auVar73._8_4_ = auVar123._8_4_ * auVar129._8_4_;
            auVar73._12_4_ = auVar123._12_4_ * auVar129._12_4_;
            auVar73._16_4_ = auVar123._16_4_ * auVar129._16_4_;
            auVar73._20_4_ = auVar123._20_4_ * auVar129._20_4_;
            auVar73._24_4_ = auVar123._24_4_ * auVar129._24_4_;
            auVar73._28_4_ = auVar123._28_4_;
            auVar107 = vfmsub231ps_fma(auVar73,auVar130,auVar119);
            auVar114 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar110),ZEXT1632(auVar107));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT1632(auVar108),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar121 = vrcp14ps_avx512vl(ZEXT1632(auVar109));
            auVar224 = ZEXT3264(auVar121);
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar119 = vfnmadd213ps_avx512vl(auVar121,ZEXT1632(auVar109),auVar38);
            auVar114 = vfmadd132ps_fma(auVar119,auVar121,auVar121);
            auVar220 = ZEXT1664(auVar114);
            auVar74._4_4_ = auVar107._4_4_ * auVar148._4_4_;
            auVar74._0_4_ = auVar107._0_4_ * auVar148._0_4_;
            auVar74._8_4_ = auVar107._8_4_ * auVar148._8_4_;
            auVar74._12_4_ = auVar107._12_4_ * auVar148._12_4_;
            auVar74._16_4_ = fVar187 * 0.0;
            auVar74._20_4_ = fVar191 * 0.0;
            auVar74._24_4_ = fVar186 * 0.0;
            auVar74._28_4_ = iVar1;
            auVar110 = vfmadd231ps_fma(auVar74,auVar124,ZEXT1632(auVar110));
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar128,ZEXT1632(auVar108));
            fVar191 = auVar114._0_4_;
            fVar186 = auVar114._4_4_;
            fVar187 = auVar114._8_4_;
            fVar188 = auVar114._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar110._12_4_ * fVar188,
                                           CONCAT48(auVar110._8_4_ * fVar187,
                                                    CONCAT44(auVar110._4_4_ * fVar186,
                                                             auVar110._0_4_ * fVar191))));
            auVar228 = ZEXT3264(local_5a0);
            auVar90._4_4_ = uStack_75c;
            auVar90._0_4_ = local_760;
            auVar90._8_4_ = uStack_758;
            auVar90._12_4_ = uStack_754;
            auVar90._16_4_ = uStack_750;
            auVar90._20_4_ = uStack_74c;
            auVar90._24_4_ = uStack_748;
            auVar90._28_4_ = uStack_744;
            uVar189 = vcmpps_avx512vl(local_5a0,auVar90,0xd);
            uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar39._4_4_ = uVar169;
            auVar39._0_4_ = uVar169;
            auVar39._8_4_ = uVar169;
            auVar39._12_4_ = uVar169;
            auVar39._16_4_ = uVar169;
            auVar39._20_4_ = uVar169;
            auVar39._24_4_ = uVar169;
            auVar39._28_4_ = uVar169;
            uVar28 = vcmpps_avx512vl(local_5a0,auVar39,2);
            bVar102 = (byte)uVar189 & (byte)uVar28 & bVar102;
            if (bVar102 != 0) {
              uVar103 = vcmpps_avx512vl(ZEXT1632(auVar109),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar103 = bVar102 & uVar103;
              if ((char)uVar103 != '\0') {
                fVar200 = auVar125._0_4_ * fVar191;
                fVar206 = auVar125._4_4_ * fVar186;
                auVar75._4_4_ = fVar206;
                auVar75._0_4_ = fVar200;
                fVar104 = auVar125._8_4_ * fVar187;
                auVar75._8_4_ = fVar104;
                fVar105 = auVar125._12_4_ * fVar188;
                auVar75._12_4_ = fVar105;
                fVar159 = auVar125._16_4_ * 0.0;
                auVar75._16_4_ = fVar159;
                fVar160 = auVar125._20_4_ * 0.0;
                auVar75._20_4_ = fVar160;
                fVar161 = auVar125._24_4_ * 0.0;
                auVar75._24_4_ = fVar161;
                auVar75._28_4_ = auVar125._28_4_;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar121 = vsubps_avx(auVar199,auVar75);
                local_5e0._0_4_ =
                     (float)((uint)(bVar91 & 1) * (int)fVar200 |
                            (uint)!(bool)(bVar91 & 1) * auVar121._0_4_);
                bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar206 | (uint)!bVar13 * auVar121._4_4_);
                bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar104 | (uint)!bVar13 * auVar121._8_4_);
                bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar105 | (uint)!bVar13 * auVar121._12_4_);
                bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar159 | (uint)!bVar13 * auVar121._16_4_);
                bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar121._20_4_);
                bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar161 | (uint)!bVar13 * auVar121._24_4_);
                bVar13 = SUB81(uVar93 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar121._28_4_);
                auVar121 = vsubps_avx(auVar118,auVar117);
                auVar114 = vfmadd213ps_fma(auVar121,local_5e0,auVar117);
                uVar169 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar40._4_4_ = uVar169;
                auVar40._0_4_ = uVar169;
                auVar40._8_4_ = uVar169;
                auVar40._12_4_ = uVar169;
                auVar40._16_4_ = uVar169;
                auVar40._20_4_ = uVar169;
                auVar40._24_4_ = uVar169;
                auVar40._28_4_ = uVar169;
                auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar114._12_4_ + auVar114._12_4_,
                                                              CONCAT48(auVar114._8_4_ +
                                                                       auVar114._8_4_,
                                                                       CONCAT44(auVar114._4_4_ +
                                                                                auVar114._4_4_,
                                                                                auVar114._0_4_ +
                                                                                auVar114._0_4_)))),
                                           auVar40);
                uVar96 = vcmpps_avx512vl(local_5a0,auVar121,6);
                uVar103 = uVar103 & uVar96;
                bVar102 = (byte)uVar103;
                if (bVar102 != 0) {
                  auVar190._0_4_ = auVar115._0_4_ * fVar191;
                  auVar190._4_4_ = auVar115._4_4_ * fVar186;
                  auVar190._8_4_ = auVar115._8_4_ * fVar187;
                  auVar190._12_4_ = auVar115._12_4_ * fVar188;
                  auVar190._16_4_ = auVar115._16_4_ * 0.0;
                  auVar190._20_4_ = auVar115._20_4_ * 0.0;
                  auVar190._24_4_ = auVar115._24_4_ * 0.0;
                  auVar190._28_4_ = 0;
                  auVar205._8_4_ = 0x3f800000;
                  auVar205._0_8_ = 0x3f8000003f800000;
                  auVar205._12_4_ = 0x3f800000;
                  auVar205._16_4_ = 0x3f800000;
                  auVar205._20_4_ = 0x3f800000;
                  auVar205._24_4_ = 0x3f800000;
                  auVar205._28_4_ = 0x3f800000;
                  auVar121 = vsubps_avx(auVar205,auVar190);
                  auVar153._0_4_ =
                       (uint)(bVar91 & 1) * (int)auVar190._0_4_ |
                       (uint)!(bool)(bVar91 & 1) * auVar121._0_4_;
                  bVar13 = (bool)((byte)(uVar93 >> 1) & 1);
                  auVar153._4_4_ =
                       (uint)bVar13 * (int)auVar190._4_4_ | (uint)!bVar13 * auVar121._4_4_;
                  bVar13 = (bool)((byte)(uVar93 >> 2) & 1);
                  auVar153._8_4_ =
                       (uint)bVar13 * (int)auVar190._8_4_ | (uint)!bVar13 * auVar121._8_4_;
                  bVar13 = (bool)((byte)(uVar93 >> 3) & 1);
                  auVar153._12_4_ =
                       (uint)bVar13 * (int)auVar190._12_4_ | (uint)!bVar13 * auVar121._12_4_;
                  bVar13 = (bool)((byte)(uVar93 >> 4) & 1);
                  auVar153._16_4_ =
                       (uint)bVar13 * (int)auVar190._16_4_ | (uint)!bVar13 * auVar121._16_4_;
                  bVar13 = (bool)((byte)(uVar93 >> 5) & 1);
                  auVar153._20_4_ =
                       (uint)bVar13 * (int)auVar190._20_4_ | (uint)!bVar13 * auVar121._20_4_;
                  bVar13 = (bool)((byte)(uVar93 >> 6) & 1);
                  auVar153._24_4_ =
                       (uint)bVar13 * (int)auVar190._24_4_ | (uint)!bVar13 * auVar121._24_4_;
                  auVar153._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar121._28_4_;
                  auVar41._8_4_ = 0x40000000;
                  auVar41._0_8_ = 0x4000000040000000;
                  auVar41._12_4_ = 0x40000000;
                  auVar41._16_4_ = 0x40000000;
                  auVar41._20_4_ = 0x40000000;
                  auVar41._24_4_ = 0x40000000;
                  auVar41._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar153,auVar205,auVar41);
                  local_580 = (undefined4)lVar100;
                  local_560 = local_850;
                  uStack_558 = uStack_848;
                  local_550 = local_860;
                  uStack_548 = uStack_858;
                  local_540 = local_870;
                  uStack_538 = uStack_868;
                  pGVar98 = (context->scene->geometries).items[uVar9].ptr;
                  if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar114 = vcvtsi2ss_avx512f(auVar113,local_580);
                    fVar191 = auVar114._0_4_;
                    local_520[0] = (fVar191 + local_5e0._0_4_ + 0.0) * local_440;
                    local_520[1] = (fVar191 + local_5e0._4_4_ + 1.0) * fStack_43c;
                    local_520[2] = (fVar191 + local_5e0._8_4_ + 2.0) * fStack_438;
                    local_520[3] = (fVar191 + local_5e0._12_4_ + 3.0) * fStack_434;
                    fStack_510 = (fVar191 + local_5e0._16_4_ + 4.0) * fStack_430;
                    fStack_50c = (fVar191 + local_5e0._20_4_ + 5.0) * fStack_42c;
                    fStack_508 = (fVar191 + local_5e0._24_4_ + 6.0) * fStack_428;
                    fStack_504 = fVar191 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar178._8_4_ = 0x7f800000;
                    auVar178._0_8_ = 0x7f8000007f800000;
                    auVar178._12_4_ = 0x7f800000;
                    auVar178._16_4_ = 0x7f800000;
                    auVar178._20_4_ = 0x7f800000;
                    auVar178._24_4_ = 0x7f800000;
                    auVar178._28_4_ = 0x7f800000;
                    auVar121 = vblendmps_avx512vl(auVar178,local_5a0);
                    auVar154._0_4_ =
                         (uint)(bVar102 & 1) * auVar121._0_4_ |
                         (uint)!(bool)(bVar102 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar154._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar154._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar154._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar103 >> 4) & 1);
                    auVar154._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar103 >> 5) & 1);
                    auVar154._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar103 >> 6) & 1);
                    auVar154._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar103 >> 7,0);
                    auVar154._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar121 = vshufps_avx(auVar154,auVar154,0xb1);
                    auVar121 = vminps_avx(auVar154,auVar121);
                    auVar119 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar119);
                    auVar119 = vpermpd_avx2(auVar121,0x4e);
                    auVar121 = vminps_avx(auVar121,auVar119);
                    uVar189 = vcmpps_avx512vl(auVar154,auVar121,0);
                    uVar94 = (uint)uVar103;
                    if ((bVar102 & (byte)uVar189) != 0) {
                      uVar94 = (uint)(bVar102 & (byte)uVar189);
                    }
                    uVar95 = 0;
                    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                      uVar95 = uVar95 + 1;
                    }
                    uVar93 = (ulong)uVar95;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_460 = vmovdqa64_avx512vl(auVar157._0_32_);
                      local_810 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7c0._0_8_ = pGVar98;
                      local_7e8 = lVar97;
                      local_7a0 = local_5a0;
                      local_57c = iVar10;
                      local_570 = auVar106;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar93]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar93 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar93 * 4);
                        local_840.context = context->user;
                        fVar188 = local_200._0_4_;
                        fVar191 = 1.0 - fVar188;
                        auVar31._8_4_ = 0x80000000;
                        auVar31._0_8_ = 0x8000000080000000;
                        auVar31._12_4_ = 0x80000000;
                        auVar110 = vxorps_avx512vl(ZEXT416((uint)fVar191),auVar31);
                        auVar114 = ZEXT416((uint)(fVar188 * fVar191 * 4.0));
                        auVar109 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar114);
                        auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),
                                                   auVar114);
                        auVar224 = ZEXT464(0x3f000000);
                        fVar191 = fVar191 * auVar110._0_4_ * 0.5;
                        fVar186 = auVar109._0_4_ * 0.5;
                        fVar187 = auVar114._0_4_ * 0.5;
                        fVar188 = fVar188 * fVar188 * 0.5;
                        auVar218._0_4_ = fVar188 * fVar3;
                        auVar218._4_4_ = fVar188 * fVar168;
                        auVar218._8_4_ = fVar188 * fVar184;
                        auVar218._12_4_ = fVar188 * fVar185;
                        auVar170._4_4_ = fVar187;
                        auVar170._0_4_ = fVar187;
                        auVar170._8_4_ = fVar187;
                        auVar170._12_4_ = fVar187;
                        auVar114 = vfmadd132ps_fma(auVar170,auVar218,auVar7);
                        auVar211._4_4_ = fVar186;
                        auVar211._0_4_ = fVar186;
                        auVar211._8_4_ = fVar186;
                        auVar211._12_4_ = fVar186;
                        auVar114 = vfmadd132ps_fma(auVar211,auVar114,auVar27);
                        auVar171._4_4_ = fVar191;
                        auVar171._0_4_ = fVar191;
                        auVar171._8_4_ = fVar191;
                        auVar171._12_4_ = fVar191;
                        auVar114 = vfmadd213ps_fma(auVar171,auVar106,auVar114);
                        auVar183 = vbroadcastss_avx512f(auVar114);
                        auVar236 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar217 = vpermps_avx512f(auVar236,ZEXT1664(auVar114));
                        auVar220 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar220,ZEXT1664(auVar114));
                        local_2c0[0] = (RTCHitN)auVar183[0];
                        local_2c0[1] = (RTCHitN)auVar183[1];
                        local_2c0[2] = (RTCHitN)auVar183[2];
                        local_2c0[3] = (RTCHitN)auVar183[3];
                        local_2c0[4] = (RTCHitN)auVar183[4];
                        local_2c0[5] = (RTCHitN)auVar183[5];
                        local_2c0[6] = (RTCHitN)auVar183[6];
                        local_2c0[7] = (RTCHitN)auVar183[7];
                        local_2c0[8] = (RTCHitN)auVar183[8];
                        local_2c0[9] = (RTCHitN)auVar183[9];
                        local_2c0[10] = (RTCHitN)auVar183[10];
                        local_2c0[0xb] = (RTCHitN)auVar183[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar183[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar183[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar183[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar183[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar183[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar183[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar183[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar183[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar183[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar183[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar183[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar183[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar183[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar183[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar183[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar183[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar183[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar183[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar183[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar183[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar183[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar183[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar183[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar183[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar183[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar183[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar183[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar183[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar183[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar183[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar183[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar183[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar183[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar183[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar183[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar183[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar183[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar183[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar183[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar183[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar183[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar183[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar183[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar183[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar183[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar183[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar183[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar183[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar183[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar183[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar183[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar183[0x3f];
                        local_280 = auVar217;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar183 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar183);
                        auVar121 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                        local_7f0[3] = auVar121;
                        local_7f0[2] = auVar121;
                        local_7f0[1] = auVar121;
                        *local_7f0 = auVar121;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]))
                        ;
                        auVar183 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar183);
                        local_840.valid = (int *)local_740;
                        local_840.geometryUserPtr = pGVar98->userPtr;
                        local_840.hit = local_2c0;
                        local_840.N = 0x10;
                        local_840.ray = (RTCRayN *)ray;
                        if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar217 = ZEXT1664(auVar217._0_16_);
                          auVar220 = ZEXT1664(auVar220._0_16_);
                          auVar224 = ZEXT1664(auVar224._0_16_);
                          (*pGVar98->intersectionFilterN)(&local_840);
                          auVar228 = ZEXT3264(local_7a0);
                          auVar183 = vmovdqa64_avx512f(local_740);
                          pGVar98 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar189 = vptestmd_avx512f(auVar183,auVar183);
                        if ((short)uVar189 == 0) {
LAB_019f14c7:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_810._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar217 = ZEXT1664(auVar217._0_16_);
                            auVar220 = ZEXT1664(auVar220._0_16_);
                            auVar224 = ZEXT1664(auVar224._0_16_);
                            (*p_Var12)(&local_840);
                            auVar228 = ZEXT3264(local_7a0);
                            auVar183 = vmovdqa64_avx512f(local_740);
                            pGVar98 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar96 = vptestmd_avx512f(auVar183,auVar183);
                          if ((short)uVar96 == 0) goto LAB_019f14c7;
                          iVar1 = *(int *)(local_840.hit + 4);
                          iVar2 = *(int *)(local_840.hit + 8);
                          iVar76 = *(int *)(local_840.hit + 0xc);
                          iVar77 = *(int *)(local_840.hit + 0x10);
                          iVar78 = *(int *)(local_840.hit + 0x14);
                          iVar79 = *(int *)(local_840.hit + 0x18);
                          iVar80 = *(int *)(local_840.hit + 0x1c);
                          iVar81 = *(int *)(local_840.hit + 0x20);
                          iVar82 = *(int *)(local_840.hit + 0x24);
                          iVar83 = *(int *)(local_840.hit + 0x28);
                          iVar84 = *(int *)(local_840.hit + 0x2c);
                          iVar85 = *(int *)(local_840.hit + 0x30);
                          iVar86 = *(int *)(local_840.hit + 0x34);
                          iVar87 = *(int *)(local_840.hit + 0x38);
                          iVar88 = *(int *)(local_840.hit + 0x3c);
                          bVar102 = (byte)uVar96;
                          bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                          bVar91 = (byte)(uVar96 >> 8);
                          bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                          bVar26 = SUB81(uVar96 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x300) =
                               (uint)(bVar102 & 1) * *(int *)local_840.hit |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x300);
                          *(uint *)(local_840.ray + 0x304) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x304);
                          *(uint *)(local_840.ray + 0x308) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x308);
                          *(uint *)(local_840.ray + 0x30c) =
                               (uint)bVar15 * iVar76 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x30c);
                          *(uint *)(local_840.ray + 0x310) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x310);
                          *(uint *)(local_840.ray + 0x314) =
                               (uint)bVar17 * iVar78 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x314);
                          *(uint *)(local_840.ray + 0x318) =
                               (uint)bVar18 * iVar79 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x318);
                          *(uint *)(local_840.ray + 0x31c) =
                               (uint)bVar19 * iVar80 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x31c);
                          *(uint *)(local_840.ray + 800) =
                               (uint)(bVar91 & 1) * iVar81 |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 800);
                          *(uint *)(local_840.ray + 0x324) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x324);
                          *(uint *)(local_840.ray + 0x328) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x328);
                          *(uint *)(local_840.ray + 0x32c) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x32c);
                          *(uint *)(local_840.ray + 0x330) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x330);
                          *(uint *)(local_840.ray + 0x334) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x334);
                          *(uint *)(local_840.ray + 0x338) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x338);
                          *(uint *)(local_840.ray + 0x33c) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x33c);
                          iVar1 = *(int *)(local_840.hit + 0x44);
                          iVar2 = *(int *)(local_840.hit + 0x48);
                          iVar76 = *(int *)(local_840.hit + 0x4c);
                          iVar77 = *(int *)(local_840.hit + 0x50);
                          iVar78 = *(int *)(local_840.hit + 0x54);
                          iVar79 = *(int *)(local_840.hit + 0x58);
                          iVar80 = *(int *)(local_840.hit + 0x5c);
                          iVar81 = *(int *)(local_840.hit + 0x60);
                          iVar82 = *(int *)(local_840.hit + 100);
                          iVar83 = *(int *)(local_840.hit + 0x68);
                          iVar84 = *(int *)(local_840.hit + 0x6c);
                          iVar85 = *(int *)(local_840.hit + 0x70);
                          iVar86 = *(int *)(local_840.hit + 0x74);
                          iVar87 = *(int *)(local_840.hit + 0x78);
                          iVar88 = *(int *)(local_840.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                          bVar26 = SUB81(uVar96 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x340) =
                               (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0x40) |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x340);
                          *(uint *)(local_840.ray + 0x344) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x344);
                          *(uint *)(local_840.ray + 0x348) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x348);
                          *(uint *)(local_840.ray + 0x34c) =
                               (uint)bVar15 * iVar76 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x34c);
                          *(uint *)(local_840.ray + 0x350) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x350);
                          *(uint *)(local_840.ray + 0x354) =
                               (uint)bVar17 * iVar78 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x354);
                          *(uint *)(local_840.ray + 0x358) =
                               (uint)bVar18 * iVar79 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x358);
                          *(uint *)(local_840.ray + 0x35c) =
                               (uint)bVar19 * iVar80 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x35c);
                          *(uint *)(local_840.ray + 0x360) =
                               (uint)(bVar91 & 1) * iVar81 |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x360);
                          *(uint *)(local_840.ray + 0x364) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x364);
                          *(uint *)(local_840.ray + 0x368) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x368);
                          *(uint *)(local_840.ray + 0x36c) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x36c);
                          *(uint *)(local_840.ray + 0x370) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x370);
                          *(uint *)(local_840.ray + 0x374) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x374);
                          *(uint *)(local_840.ray + 0x378) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x378);
                          *(uint *)(local_840.ray + 0x37c) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x37c);
                          iVar1 = *(int *)(local_840.hit + 0x84);
                          iVar2 = *(int *)(local_840.hit + 0x88);
                          iVar76 = *(int *)(local_840.hit + 0x8c);
                          iVar77 = *(int *)(local_840.hit + 0x90);
                          iVar78 = *(int *)(local_840.hit + 0x94);
                          iVar79 = *(int *)(local_840.hit + 0x98);
                          iVar80 = *(int *)(local_840.hit + 0x9c);
                          iVar81 = *(int *)(local_840.hit + 0xa0);
                          iVar82 = *(int *)(local_840.hit + 0xa4);
                          iVar83 = *(int *)(local_840.hit + 0xa8);
                          iVar84 = *(int *)(local_840.hit + 0xac);
                          iVar85 = *(int *)(local_840.hit + 0xb0);
                          iVar86 = *(int *)(local_840.hit + 0xb4);
                          iVar87 = *(int *)(local_840.hit + 0xb8);
                          iVar88 = *(int *)(local_840.hit + 0xbc);
                          bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                          bVar26 = SUB81(uVar96 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x380) =
                               (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0x80) |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x380);
                          *(uint *)(local_840.ray + 900) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_840.ray + 900);
                          *(uint *)(local_840.ray + 0x388) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x388);
                          *(uint *)(local_840.ray + 0x38c) =
                               (uint)bVar15 * iVar76 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x38c);
                          *(uint *)(local_840.ray + 0x390) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x390);
                          *(uint *)(local_840.ray + 0x394) =
                               (uint)bVar17 * iVar78 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x394);
                          *(uint *)(local_840.ray + 0x398) =
                               (uint)bVar18 * iVar79 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x398);
                          *(uint *)(local_840.ray + 0x39c) =
                               (uint)bVar19 * iVar80 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x39c);
                          *(uint *)(local_840.ray + 0x3a0) =
                               (uint)(bVar91 & 1) * iVar81 |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x3a0);
                          *(uint *)(local_840.ray + 0x3a4) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3a4);
                          *(uint *)(local_840.ray + 0x3a8) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3a8);
                          *(uint *)(local_840.ray + 0x3ac) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3ac);
                          *(uint *)(local_840.ray + 0x3b0) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3b0);
                          *(uint *)(local_840.ray + 0x3b4) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3b4);
                          *(uint *)(local_840.ray + 0x3b8) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3b8);
                          *(uint *)(local_840.ray + 0x3bc) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3bc);
                          iVar1 = *(int *)(local_840.hit + 0xc4);
                          iVar2 = *(int *)(local_840.hit + 200);
                          iVar76 = *(int *)(local_840.hit + 0xcc);
                          iVar77 = *(int *)(local_840.hit + 0xd0);
                          iVar78 = *(int *)(local_840.hit + 0xd4);
                          iVar79 = *(int *)(local_840.hit + 0xd8);
                          iVar80 = *(int *)(local_840.hit + 0xdc);
                          iVar81 = *(int *)(local_840.hit + 0xe0);
                          iVar82 = *(int *)(local_840.hit + 0xe4);
                          iVar83 = *(int *)(local_840.hit + 0xe8);
                          iVar84 = *(int *)(local_840.hit + 0xec);
                          iVar85 = *(int *)(local_840.hit + 0xf0);
                          iVar86 = *(int *)(local_840.hit + 0xf4);
                          iVar87 = *(int *)(local_840.hit + 0xf8);
                          iVar88 = *(int *)(local_840.hit + 0xfc);
                          bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                          bVar26 = SUB81(uVar96 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x3c0) =
                               (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0xc0) |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x3c0);
                          *(uint *)(local_840.ray + 0x3c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x3c4);
                          *(uint *)(local_840.ray + 0x3c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x3c8);
                          *(uint *)(local_840.ray + 0x3cc) =
                               (uint)bVar15 * iVar76 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x3cc);
                          *(uint *)(local_840.ray + 0x3d0) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x3d0);
                          *(uint *)(local_840.ray + 0x3d4) =
                               (uint)bVar17 * iVar78 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x3d4);
                          *(uint *)(local_840.ray + 0x3d8) =
                               (uint)bVar18 * iVar79 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x3d8);
                          *(uint *)(local_840.ray + 0x3dc) =
                               (uint)bVar19 * iVar80 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3dc);
                          *(uint *)(local_840.ray + 0x3e0) =
                               (uint)(bVar91 & 1) * iVar81 |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x3e0);
                          *(uint *)(local_840.ray + 0x3e4) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3e4);
                          *(uint *)(local_840.ray + 1000) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 1000);
                          *(uint *)(local_840.ray + 0x3ec) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3ec);
                          *(uint *)(local_840.ray + 0x3f0) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3f0);
                          *(uint *)(local_840.ray + 0x3f4) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3f4);
                          *(uint *)(local_840.ray + 0x3f8) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3f8);
                          *(uint *)(local_840.ray + 0x3fc) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3fc);
                          iVar1 = *(int *)(local_840.hit + 0x104);
                          iVar2 = *(int *)(local_840.hit + 0x108);
                          iVar76 = *(int *)(local_840.hit + 0x10c);
                          iVar77 = *(int *)(local_840.hit + 0x110);
                          iVar78 = *(int *)(local_840.hit + 0x114);
                          iVar79 = *(int *)(local_840.hit + 0x118);
                          iVar80 = *(int *)(local_840.hit + 0x11c);
                          iVar81 = *(int *)(local_840.hit + 0x120);
                          iVar82 = *(int *)(local_840.hit + 0x124);
                          iVar83 = *(int *)(local_840.hit + 0x128);
                          iVar84 = *(int *)(local_840.hit + 300);
                          iVar85 = *(int *)(local_840.hit + 0x130);
                          iVar86 = *(int *)(local_840.hit + 0x134);
                          iVar87 = *(int *)(local_840.hit + 0x138);
                          iVar88 = *(int *)(local_840.hit + 0x13c);
                          bVar13 = (bool)((byte)(uVar96 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar96 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar96 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar96 >> 6) & 1);
                          bVar19 = (bool)((byte)(uVar96 >> 7) & 1);
                          bVar20 = (bool)((byte)(uVar96 >> 9) & 1);
                          bVar21 = (bool)((byte)(uVar96 >> 10) & 1);
                          bVar22 = (bool)((byte)(uVar96 >> 0xb) & 1);
                          bVar23 = (bool)((byte)(uVar96 >> 0xc) & 1);
                          bVar24 = (bool)((byte)(uVar96 >> 0xd) & 1);
                          bVar25 = (bool)((byte)(uVar96 >> 0xe) & 1);
                          bVar26 = SUB81(uVar96 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x400) =
                               (uint)(bVar102 & 1) * *(int *)(local_840.hit + 0x100) |
                               (uint)!(bool)(bVar102 & 1) * *(int *)(local_840.ray + 0x400);
                          *(uint *)(local_840.ray + 0x404) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_840.ray + 0x404);
                          *(uint *)(local_840.ray + 0x408) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_840.ray + 0x408);
                          *(uint *)(local_840.ray + 0x40c) =
                               (uint)bVar15 * iVar76 |
                               (uint)!bVar15 * *(int *)(local_840.ray + 0x40c);
                          *(uint *)(local_840.ray + 0x410) =
                               (uint)bVar16 * iVar77 |
                               (uint)!bVar16 * *(int *)(local_840.ray + 0x410);
                          *(uint *)(local_840.ray + 0x414) =
                               (uint)bVar17 * iVar78 |
                               (uint)!bVar17 * *(int *)(local_840.ray + 0x414);
                          *(uint *)(local_840.ray + 0x418) =
                               (uint)bVar18 * iVar79 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x418);
                          *(uint *)(local_840.ray + 0x41c) =
                               (uint)bVar19 * iVar80 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x41c);
                          *(uint *)(local_840.ray + 0x420) =
                               (uint)(bVar91 & 1) * iVar81 |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_840.ray + 0x420);
                          *(uint *)(local_840.ray + 0x424) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x424);
                          *(uint *)(local_840.ray + 0x428) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x428);
                          *(uint *)(local_840.ray + 0x42c) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x42c);
                          *(uint *)(local_840.ray + 0x430) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x430);
                          *(uint *)(local_840.ray + 0x434) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x434);
                          *(uint *)(local_840.ray + 0x438) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x438);
                          *(uint *)(local_840.ray + 0x43c) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x43c);
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140)
                                                      );
                          auVar183 = vmovdqu32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180)
                                                      );
                          auVar183 = vmovdqu32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0)
                                                      );
                          auVar183 = vmovdqa32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200)
                                                      );
                          auVar183 = vmovdqa32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar183;
                          local_810._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_810._4_4_ = 0;
                          local_810._8_4_ = 0;
                          local_810._12_4_ = 0;
                        }
                        bVar102 = ~(byte)(1 << ((uint)uVar93 & 0x1f)) & (byte)uVar103;
                        auVar179._4_4_ = local_810._0_4_;
                        auVar179._0_4_ = local_810._0_4_;
                        auVar179._8_4_ = local_810._0_4_;
                        auVar179._12_4_ = local_810._0_4_;
                        auVar179._16_4_ = local_810._0_4_;
                        auVar179._20_4_ = local_810._0_4_;
                        auVar179._24_4_ = local_810._0_4_;
                        auVar179._28_4_ = local_810._0_4_;
                        uVar189 = vcmpps_avx512vl(auVar228._0_32_,auVar179,2);
                        if ((bVar102 & (byte)uVar189) == 0) goto LAB_019f1564;
                        bVar102 = bVar102 & (byte)uVar189;
                        uVar103 = (ulong)bVar102;
                        auVar180._8_4_ = 0x7f800000;
                        auVar180._0_8_ = 0x7f8000007f800000;
                        auVar180._12_4_ = 0x7f800000;
                        auVar180._16_4_ = 0x7f800000;
                        auVar180._20_4_ = 0x7f800000;
                        auVar180._24_4_ = 0x7f800000;
                        auVar180._28_4_ = 0x7f800000;
                        auVar121 = vblendmps_avx512vl(auVar180,auVar228._0_32_);
                        auVar155._0_4_ =
                             (uint)(bVar102 & 1) * auVar121._0_4_ |
                             (uint)!(bool)(bVar102 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar102 >> 1 & 1);
                        auVar155._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar102 >> 2 & 1);
                        auVar155._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar102 >> 3 & 1);
                        auVar155._12_4_ =
                             (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar102 >> 4 & 1);
                        auVar155._16_4_ =
                             (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar102 >> 5 & 1);
                        auVar155._20_4_ =
                             (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar102 >> 6 & 1);
                        auVar155._24_4_ =
                             (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar155._28_4_ =
                             (uint)(bVar102 >> 7) * auVar121._28_4_ |
                             (uint)!(bool)(bVar102 >> 7) * 0x7f800000;
                        auVar121 = vshufps_avx(auVar155,auVar155,0xb1);
                        auVar121 = vminps_avx(auVar155,auVar121);
                        auVar119 = vshufpd_avx(auVar121,auVar121,5);
                        auVar121 = vminps_avx(auVar121,auVar119);
                        auVar119 = vpermpd_avx2(auVar121,0x4e);
                        auVar121 = vminps_avx(auVar121,auVar119);
                        uVar189 = vcmpps_avx512vl(auVar155,auVar121,0);
                        bVar91 = (byte)uVar189 & bVar102;
                        if (bVar91 != 0) {
                          bVar102 = bVar91;
                        }
                        uVar94 = 0;
                        for (uVar95 = (uint)bVar102; (uVar95 & 1) == 0;
                            uVar95 = uVar95 >> 1 | 0x80000000) {
                          uVar94 = uVar94 + 1;
                        }
                        uVar93 = (ulong)uVar94;
                      } while( true );
                    }
                    fVar191 = local_520[uVar93];
                    uVar169 = *(undefined4 *)(local_500 + uVar93 * 4);
                    fVar186 = 1.0 - fVar191;
                    auVar30._8_4_ = 0x80000000;
                    auVar30._0_8_ = 0x8000000080000000;
                    auVar30._12_4_ = 0x80000000;
                    auVar110 = vxorps_avx512vl(ZEXT416((uint)fVar186),auVar30);
                    auVar114 = ZEXT416((uint)(fVar191 * fVar186 * 4.0));
                    auVar109 = vfnmsub213ss_fma(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),
                                                auVar114);
                    auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),
                                               auVar114);
                    fVar186 = fVar186 * auVar110._0_4_ * 0.5;
                    fVar187 = auVar109._0_4_ * 0.5;
                    auVar220 = ZEXT464((uint)fVar187);
                    fVar188 = auVar114._0_4_ * 0.5;
                    fVar200 = fVar191 * fVar191 * 0.5;
                    auVar209._0_4_ = fVar200 * fVar3;
                    auVar209._4_4_ = fVar200 * fVar168;
                    auVar209._8_4_ = fVar200 * fVar184;
                    auVar209._12_4_ = fVar200 * fVar185;
                    auVar196._4_4_ = fVar188;
                    auVar196._0_4_ = fVar188;
                    auVar196._8_4_ = fVar188;
                    auVar196._12_4_ = fVar188;
                    auVar114 = vfmadd132ps_fma(auVar196,auVar209,auVar7);
                    auVar210._4_4_ = fVar187;
                    auVar210._0_4_ = fVar187;
                    auVar210._8_4_ = fVar187;
                    auVar210._12_4_ = fVar187;
                    auVar114 = vfmadd132ps_fma(auVar210,auVar114,auVar27);
                    auVar217 = ZEXT1664(auVar114);
                    auVar197._4_4_ = fVar186;
                    auVar197._0_4_ = fVar186;
                    auVar197._8_4_ = fVar186;
                    auVar197._12_4_ = fVar186;
                    auVar114 = vfmadd213ps_fma(auVar197,auVar106,auVar114);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar93 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar114._0_4_;
                    uVar11 = vextractps_avx(auVar114,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar11;
                    uVar11 = vextractps_avx(auVar114,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar11;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar169;
                    *(undefined4 *)(ray + k * 4 + 0x440) = uVar4;
                    *(uint *)(ray + k * 4 + 0x480) = uVar9;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019f1184;
      }
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar37._4_4_ = uVar4;
    auVar37._0_4_ = uVar4;
    auVar37._8_4_ = uVar4;
    auVar37._12_4_ = uVar4;
    auVar37._16_4_ = uVar4;
    auVar37._20_4_ = uVar4;
    auVar37._24_4_ = uVar4;
    auVar37._28_4_ = uVar4;
    uVar189 = vcmpps_avx512vl(local_3a0,auVar37,2);
    uVar99 = (ulong)((uint)uVar99 & (uint)uVar189);
  } while( true );
LAB_019f1564:
  auVar121 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar236 = ZEXT3264(auVar121);
  auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar114);
  auVar183 = ZEXT464(0x35000000);
  auVar121 = vmovdqa64_avx512vl(local_460);
  auVar157 = ZEXT3264(auVar121);
  lVar97 = local_7e8;
LAB_019f1184:
  lVar100 = lVar100 + 8;
  goto LAB_019f087d;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }